

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersector1<4>::
     intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  bool bVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  undefined8 unaff_RBP;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined4 uVar82;
  vint4 bi_2;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 bi_1;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar115;
  float fVar116;
  vint4 ai_2;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar117;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  vint4 bi;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  vint4 ai;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  vint4 ai_1;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  vfloat4 a0_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar183;
  float fVar194;
  float fVar196;
  vfloat4 a0_1;
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar210;
  float fVar211;
  vfloat4 a0;
  float fVar212;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_304;
  ulong local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  RTCFilterFunctionNArguments local_248;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined8 uStack_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar20;
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar223 [32];
  
  uVar19 = (ulong)(byte)prim[1];
  fVar202 = *(float *)(prim + uVar19 * 0x19 + 0x12);
  auVar30 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar19 * 0x19 + 6));
  auVar47._0_4_ = fVar202 * auVar30._0_4_;
  auVar47._4_4_ = fVar202 * auVar30._4_4_;
  auVar47._8_4_ = fVar202 * auVar30._8_4_;
  auVar47._12_4_ = fVar202 * auVar30._12_4_;
  auVar45._0_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar45._4_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar45._8_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar45._12_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar30 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 4 + 6)));
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar31 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 5 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar31);
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 6 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar32);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0xb + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0xc + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0xd + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0x12 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0x13 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar19 * 0x14 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar213._4_4_ = auVar45._0_4_;
  auVar213._0_4_ = auVar45._0_4_;
  auVar213._8_4_ = auVar45._0_4_;
  auVar213._12_4_ = auVar45._0_4_;
  auVar44 = vshufps_avx(auVar45,auVar45,0x55);
  auVar34 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar202 = auVar34._0_4_;
  auVar118._0_4_ = fVar202 * auVar32._0_4_;
  fVar183 = auVar34._4_4_;
  auVar118._4_4_ = fVar183 * auVar32._4_4_;
  fVar195 = auVar34._8_4_;
  auVar118._8_4_ = fVar195 * auVar32._8_4_;
  fVar197 = auVar34._12_4_;
  auVar118._12_4_ = fVar197 * auVar32._12_4_;
  auVar91._0_4_ = auVar40._0_4_ * fVar202;
  auVar91._4_4_ = auVar40._4_4_ * fVar183;
  auVar91._8_4_ = auVar40._8_4_ * fVar195;
  auVar91._12_4_ = auVar40._12_4_ * fVar197;
  auVar42._0_4_ = auVar35._0_4_ * fVar202;
  auVar42._4_4_ = auVar35._4_4_ * fVar183;
  auVar42._8_4_ = auVar35._8_4_ * fVar195;
  auVar42._12_4_ = auVar35._12_4_ * fVar197;
  auVar34 = vfmadd231ps_fma(auVar118,auVar44,auVar31);
  auVar36 = vfmadd231ps_fma(auVar91,auVar44,auVar41);
  auVar44 = vfmadd231ps_fma(auVar42,auVar38,auVar44);
  auVar37 = vfmadd231ps_fma(auVar34,auVar213,auVar30);
  auVar36 = vfmadd231ps_fma(auVar36,auVar213,auVar33);
  auVar45 = vfmadd231ps_fma(auVar44,auVar39,auVar213);
  auVar214._4_4_ = auVar47._0_4_;
  auVar214._0_4_ = auVar47._0_4_;
  auVar214._8_4_ = auVar47._0_4_;
  auVar214._12_4_ = auVar47._0_4_;
  auVar44 = vshufps_avx(auVar47,auVar47,0x55);
  auVar34 = vshufps_avx(auVar47,auVar47,0xaa);
  fVar202 = auVar34._0_4_;
  auVar224._0_4_ = fVar202 * auVar32._0_4_;
  fVar183 = auVar34._4_4_;
  auVar224._4_4_ = fVar183 * auVar32._4_4_;
  fVar195 = auVar34._8_4_;
  auVar224._8_4_ = fVar195 * auVar32._8_4_;
  fVar197 = auVar34._12_4_;
  auVar224._12_4_ = fVar197 * auVar32._12_4_;
  auVar109._0_4_ = auVar40._0_4_ * fVar202;
  auVar109._4_4_ = auVar40._4_4_ * fVar183;
  auVar109._8_4_ = auVar40._8_4_ * fVar195;
  auVar109._12_4_ = auVar40._12_4_ * fVar197;
  auVar48._0_4_ = auVar35._0_4_ * fVar202;
  auVar48._4_4_ = auVar35._4_4_ * fVar183;
  auVar48._8_4_ = auVar35._8_4_ * fVar195;
  auVar48._12_4_ = auVar35._12_4_ * fVar197;
  auVar31 = vfmadd231ps_fma(auVar224,auVar44,auVar31);
  auVar32 = vfmadd231ps_fma(auVar109,auVar44,auVar41);
  auVar41 = vfmadd231ps_fma(auVar48,auVar44,auVar38);
  auVar40 = vfmadd231ps_fma(auVar31,auVar214,auVar30);
  auVar38 = vfmadd231ps_fma(auVar32,auVar214,auVar33);
  auVar66._16_16_ = in_YmmResult._16_16_;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar235 = ZEXT1664(auVar30);
  auVar35 = vfmadd231ps_fma(auVar41,auVar214,auVar39);
  auVar31 = vandps_avx512vl(auVar37,auVar30);
  auVar140._8_4_ = 0x219392ef;
  auVar140._0_8_ = 0x219392ef219392ef;
  auVar140._12_4_ = 0x219392ef;
  uVar24 = vcmpps_avx512vl(auVar31,auVar140,1);
  bVar28 = (bool)((byte)uVar24 & 1);
  auVar34._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar37._0_4_;
  bVar28 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar34._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar37._4_4_;
  bVar28 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar34._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar37._8_4_;
  bVar28 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar34._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar37._12_4_;
  auVar31 = vandps_avx512vl(auVar36,auVar30);
  uVar24 = vcmpps_avx512vl(auVar31,auVar140,1);
  bVar28 = (bool)((byte)uVar24 & 1);
  auVar37._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar36._0_4_;
  bVar28 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar37._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar36._4_4_;
  bVar28 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar37._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar36._8_4_;
  bVar28 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar37._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar36._12_4_;
  auVar30 = vandps_avx512vl(auVar45,auVar30);
  uVar24 = vcmpps_avx512vl(auVar30,auVar140,1);
  bVar28 = (bool)((byte)uVar24 & 1);
  auVar36._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._0_4_;
  bVar28 = (bool)((byte)(uVar24 >> 1) & 1);
  auVar36._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._4_4_;
  bVar28 = (bool)((byte)(uVar24 >> 2) & 1);
  auVar36._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._8_4_;
  bVar28 = (bool)((byte)(uVar24 >> 3) & 1);
  auVar36._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._12_4_;
  auVar30 = vrcp14ps_avx512vl(auVar34);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar236 = ZEXT1664(auVar31);
  auVar32 = vfnmadd213ps_avx512vl(auVar34,auVar30,auVar31);
  auVar32 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar37);
  auVar33 = vfnmadd213ps_avx512vl(auVar37,auVar30,auVar31);
  auVar41 = vfmadd132ps_fma(auVar33,auVar30,auVar30);
  auVar30 = vrcp14ps_avx512vl(auVar36);
  auVar31 = vfnmadd213ps_avx512vl(auVar36,auVar30,auVar31);
  auVar39 = vfmadd132ps_fma(auVar31,auVar30,auVar30);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar19 * 7 + 6);
  auVar30 = vpmovsxwd_avx(auVar30);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar40);
  auVar127._0_4_ = auVar32._0_4_ * auVar30._0_4_;
  auVar127._4_4_ = auVar32._4_4_ * auVar30._4_4_;
  auVar127._8_4_ = auVar32._8_4_ * auVar30._8_4_;
  auVar127._12_4_ = auVar32._12_4_ * auVar30._12_4_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar19 * 9 + 6);
  auVar30 = vpmovsxwd_avx(auVar31);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar40);
  auVar119._0_4_ = auVar32._0_4_ * auVar30._0_4_;
  auVar119._4_4_ = auVar32._4_4_ * auVar30._4_4_;
  auVar119._8_4_ = auVar32._8_4_ * auVar30._8_4_;
  auVar119._12_4_ = auVar32._12_4_ * auVar30._12_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar19 * 0xe + 6);
  auVar30 = vpmovsxwd_avx(auVar32);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar38);
  auVar141._0_4_ = auVar41._0_4_ * auVar30._0_4_;
  auVar141._4_4_ = auVar41._4_4_ * auVar30._4_4_;
  auVar141._8_4_ = auVar41._8_4_ * auVar30._8_4_;
  auVar141._12_4_ = auVar41._12_4_ * auVar30._12_4_;
  auVar32 = vpbroadcastd_avx512vl();
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar30 = vpmovsxwd_avx(auVar33);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar38);
  auVar46._0_4_ = auVar41._0_4_ * auVar30._0_4_;
  auVar46._4_4_ = auVar41._4_4_ * auVar30._4_4_;
  auVar46._8_4_ = auVar41._8_4_ * auVar30._8_4_;
  auVar46._12_4_ = auVar41._12_4_ * auVar30._12_4_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar19 * 0x15 + 6);
  auVar30 = vpmovsxwd_avx(auVar41);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar35);
  auVar110._0_4_ = auVar39._0_4_ * auVar30._0_4_;
  auVar110._4_4_ = auVar39._4_4_ * auVar30._4_4_;
  auVar110._8_4_ = auVar39._8_4_ * auVar30._8_4_;
  auVar110._12_4_ = auVar39._12_4_ * auVar30._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar19 * 0x17 + 6);
  auVar30 = vpmovsxwd_avx(auVar40);
  auVar30 = vcvtdq2ps_avx(auVar30);
  auVar30 = vsubps_avx(auVar30,auVar35);
  auVar43._0_4_ = auVar39._0_4_ * auVar30._0_4_;
  auVar43._4_4_ = auVar39._4_4_ * auVar30._4_4_;
  auVar43._8_4_ = auVar39._8_4_ * auVar30._8_4_;
  auVar43._12_4_ = auVar39._12_4_ * auVar30._12_4_;
  auVar30 = vpminsd_avx(auVar127,auVar119);
  auVar31 = vpminsd_avx(auVar141,auVar46);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar31 = vpminsd_avx(auVar110,auVar43);
  uVar82 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar39._4_4_ = uVar82;
  auVar39._0_4_ = uVar82;
  auVar39._8_4_ = uVar82;
  auVar39._12_4_ = uVar82;
  auVar31 = vmaxps_avx512vl(auVar31,auVar39);
  auVar30 = vmaxps_avx(auVar30,auVar31);
  auVar38._8_4_ = 0x3f7ffffa;
  auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar38._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar30,auVar38);
  auVar30 = vpmaxsd_avx(auVar127,auVar119);
  auVar31 = vpmaxsd_avx(auVar141,auVar46);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar31 = vpmaxsd_avx(auVar110,auVar43);
  fVar202 = (ray->super_RayK<1>).tfar;
  auVar35._4_4_ = fVar202;
  auVar35._0_4_ = fVar202;
  auVar35._8_4_ = fVar202;
  auVar35._12_4_ = fVar202;
  auVar31 = vminps_avx512vl(auVar31,auVar35);
  auVar30 = vminps_avx(auVar30,auVar31);
  auVar44._8_4_ = 0x3f800003;
  auVar44._0_8_ = 0x3f8000033f800003;
  auVar44._12_4_ = 0x3f800003;
  auVar30 = vmulps_avx512vl(auVar30,auVar44);
  uVar10 = vcmpps_avx512vl(local_158,auVar30,2);
  uVar11 = vpcmpgtd_avx512vl(auVar32,_DAT_01f4ad30);
  uVar24 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar10 & 0xf & (byte)uVar11));
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar230 = ZEXT1664(auVar30);
  auVar66._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar231 = ZEXT1664(auVar66._0_16_);
  auVar239 = ZEXT464(0x3f800000);
LAB_017a3a5e:
  if (uVar24 == 0) {
    return;
  }
  lVar21 = 0;
  for (uVar19 = uVar24; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  local_300 = (ulong)*(uint *)(prim + lVar21 * 4 + 6);
  uVar19 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar21 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar30 = *(undefined1 (*) [16])(_Var9 + uVar19 * (long)pvVar8);
  auVar31 = *(undefined1 (*) [16])(_Var9 + (uVar19 + 1) * (long)pvVar8);
  auVar32 = *(undefined1 (*) [16])(_Var9 + (uVar19 + 2) * (long)pvVar8);
  auVar33 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar19 + 3));
  lVar21 = *(long *)&pGVar6[1].time_range.upper;
  auVar41 = *(undefined1 (*) [16])(lVar21 + (long)p_Var7 * uVar19);
  auVar40 = *(undefined1 (*) [16])(lVar21 + (long)p_Var7 * (uVar19 + 1));
  auVar39 = *(undefined1 (*) [16])(lVar21 + (long)p_Var7 * (uVar19 + 2));
  uVar24 = uVar24 - 1 & uVar24;
  auVar38 = *(undefined1 (*) [16])(lVar21 + (long)p_Var7 * (uVar19 + 3));
  if (uVar24 != 0) {
    uVar25 = uVar24 - 1 & uVar24;
    for (uVar19 = uVar24; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
    }
    if (uVar25 != 0) {
      for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar49._16_16_ = auVar66._16_16_;
  auVar49._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar34 = vmulps_avx512vl(auVar38,auVar49._0_16_);
  auVar219._8_4_ = 0x3e2aaaab;
  auVar219._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar219._12_4_ = 0x3e2aaaab;
  auVar35 = vfmadd213ps_fma(auVar219,auVar39,auVar34);
  auVar215._8_4_ = 0x3f2aaaab;
  auVar215._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar215._12_4_ = 0x3f2aaaab;
  auVar35 = vfmadd231ps_fma(auVar35,auVar40,auVar215);
  auVar44 = vfmadd231ps_fma(auVar35,auVar41,auVar219);
  auVar45 = auVar230._0_16_;
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar39,auVar45);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar40,auVar49._0_16_);
  auVar36 = vfnmadd231ps_avx512vl(auVar35,auVar41,auVar45);
  auVar34 = vmulps_avx512vl(auVar33,auVar49._0_16_);
  auVar35 = vfmadd213ps_fma(auVar219,auVar32,auVar34);
  auVar35 = vfmadd231ps_fma(auVar35,auVar31,auVar215);
  auVar35 = vfmadd231ps_fma(auVar35,auVar30,auVar219);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar32,auVar45);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar31,auVar49._0_16_);
  auVar37 = vfnmadd231ps_avx512vl(auVar34,auVar30,auVar45);
  auVar97._0_4_ = auVar38._0_4_ * 0.16666667;
  auVar97._4_4_ = auVar38._4_4_ * 0.16666667;
  auVar97._8_4_ = auVar38._8_4_ * 0.16666667;
  auVar97._12_4_ = auVar38._12_4_ * 0.16666667;
  auVar34 = vfmadd231ps_fma(auVar97,auVar39,auVar215);
  auVar34 = vfmadd231ps_fma(auVar34,auVar40,auVar219);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar41,auVar49._0_16_);
  auVar38 = vmulps_avx512vl(auVar38,auVar45);
  auVar39 = vfmadd231ps_avx512vl(auVar38,auVar49._0_16_,auVar39);
  auVar40 = vfnmadd231ps_avx512vl(auVar39,auVar45,auVar40);
  auVar39 = vfnmadd231ps_avx512vl(auVar40,auVar49._0_16_,auVar41);
  auVar158._0_4_ = auVar33._0_4_ * 0.16666667;
  auVar158._4_4_ = auVar33._4_4_ * 0.16666667;
  auVar158._8_4_ = auVar33._8_4_ * 0.16666667;
  auVar158._12_4_ = auVar33._12_4_ * 0.16666667;
  auVar41 = vfmadd231ps_fma(auVar158,auVar32,auVar215);
  auVar41 = vfmadd231ps_fma(auVar41,auVar31,auVar219);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar30,auVar49._0_16_);
  auVar33 = vmulps_avx512vl(auVar33,auVar45);
  auVar32 = vfmadd231ps_avx512vl(auVar33,auVar49._0_16_,auVar32);
  auVar31 = vfnmadd231ps_avx512vl(auVar32,auVar45,auVar31);
  auVar40 = vfnmadd231ps_avx512vl(auVar31,auVar49._0_16_,auVar30);
  auVar30 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar31 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar199 = auVar36._0_4_;
  auVar128._0_4_ = fVar199 * auVar31._0_4_;
  fVar200 = auVar36._4_4_;
  auVar128._4_4_ = fVar200 * auVar31._4_4_;
  fVar201 = auVar36._8_4_;
  auVar128._8_4_ = fVar201 * auVar31._8_4_;
  fVar90 = auVar36._12_4_;
  auVar128._12_4_ = fVar90 * auVar31._12_4_;
  auVar31 = vfmsub231ps_fma(auVar128,auVar30,auVar35);
  auVar32 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar129._0_4_ = fVar199 * auVar31._0_4_;
  auVar129._4_4_ = fVar200 * auVar31._4_4_;
  auVar129._8_4_ = fVar201 * auVar31._8_4_;
  auVar129._12_4_ = fVar90 * auVar31._12_4_;
  auVar30 = vfmsub231ps_fma(auVar129,auVar30,auVar37);
  auVar33 = vshufps_avx(auVar30,auVar30,0xc9);
  auVar30 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar31 = vshufps_avx(auVar41,auVar41,0xc9);
  fVar108 = auVar39._0_4_;
  auVar120._0_4_ = fVar108 * auVar31._0_4_;
  fVar115 = auVar39._4_4_;
  auVar120._4_4_ = fVar115 * auVar31._4_4_;
  fVar116 = auVar39._8_4_;
  auVar120._8_4_ = fVar116 * auVar31._8_4_;
  fVar117 = auVar39._12_4_;
  auVar120._12_4_ = fVar117 * auVar31._12_4_;
  auVar31 = vfmsub231ps_fma(auVar120,auVar30,auVar41);
  auVar41 = vshufps_avx(auVar31,auVar31,0xc9);
  auVar31 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar159._0_4_ = auVar31._0_4_ * fVar108;
  auVar159._4_4_ = auVar31._4_4_ * fVar115;
  auVar159._8_4_ = auVar31._8_4_ * fVar116;
  auVar159._12_4_ = auVar31._12_4_ * fVar117;
  auVar31 = vfmsub231ps_fma(auVar159,auVar30,auVar40);
  auVar30 = vdpps_avx(auVar32,auVar32,0x7f);
  auVar40 = vshufps_avx(auVar31,auVar31,0xc9);
  fVar183 = auVar30._0_4_;
  auVar64._4_28_ = auVar49._4_28_;
  auVar64._0_4_ = fVar183;
  auVar31 = vrsqrt14ss_avx512f(auVar49._0_16_,auVar64._0_16_);
  fVar202 = auVar31._0_4_;
  auVar31 = vdpps_avx(auVar32,auVar33,0x7f);
  fVar202 = fVar202 * 1.5 + fVar183 * -0.5 * fVar202 * fVar202 * fVar202;
  fVar182 = fVar202 * auVar32._0_4_;
  fVar194 = fVar202 * auVar32._4_4_;
  fVar196 = fVar202 * auVar32._8_4_;
  fVar198 = fVar202 * auVar32._12_4_;
  auVar166._0_4_ = auVar33._0_4_ * fVar183;
  auVar166._4_4_ = auVar33._4_4_ * fVar183;
  auVar166._8_4_ = auVar33._8_4_ * fVar183;
  auVar166._12_4_ = auVar33._12_4_ * fVar183;
  fVar183 = auVar31._0_4_;
  auVar142._0_4_ = fVar183 * auVar32._0_4_;
  auVar142._4_4_ = fVar183 * auVar32._4_4_;
  auVar142._8_4_ = fVar183 * auVar32._8_4_;
  auVar142._12_4_ = fVar183 * auVar32._12_4_;
  auVar32 = vsubps_avx(auVar166,auVar142);
  auVar31 = vrcp14ss_avx512f(auVar49._0_16_,auVar64._0_16_);
  auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
  fVar195 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vdpps_avx(auVar41,auVar41,0x7f);
  fVar197 = auVar30._0_4_;
  auVar65._16_16_ = auVar49._16_16_;
  auVar65._0_16_ = auVar49._0_16_;
  auVar50._4_28_ = auVar65._4_28_;
  auVar50._0_4_ = fVar197;
  auVar31 = vrsqrt14ss_avx512f(auVar49._0_16_,auVar50._0_16_);
  fVar183 = auVar31._0_4_;
  fVar183 = fVar183 * 1.5 + fVar197 * -0.5 * fVar183 * fVar183 * fVar183;
  auVar31 = vdpps_avx(auVar41,auVar40,0x7f);
  fVar203 = fVar183 * auVar41._0_4_;
  fVar210 = fVar183 * auVar41._4_4_;
  fVar211 = fVar183 * auVar41._8_4_;
  fVar212 = fVar183 * auVar41._12_4_;
  auVar130._0_4_ = fVar197 * auVar40._0_4_;
  auVar130._4_4_ = fVar197 * auVar40._4_4_;
  auVar130._8_4_ = fVar197 * auVar40._8_4_;
  auVar130._12_4_ = fVar197 * auVar40._12_4_;
  fVar197 = auVar31._0_4_;
  auVar121._0_4_ = fVar197 * auVar41._0_4_;
  auVar121._4_4_ = fVar197 * auVar41._4_4_;
  auVar121._8_4_ = fVar197 * auVar41._8_4_;
  auVar121._12_4_ = fVar197 * auVar41._12_4_;
  auVar33 = vsubps_avx(auVar130,auVar121);
  auVar31 = vrcp14ss_avx512f(auVar49._0_16_,auVar50._0_16_);
  auVar30 = vfnmadd213ss_avx512f(auVar30,auVar31,ZEXT416(0x40000000));
  fVar197 = auVar31._0_4_ * auVar30._0_4_;
  auVar30 = vshufps_avx(auVar44,auVar44,0xff);
  auVar149._0_4_ = fVar182 * auVar30._0_4_;
  auVar149._4_4_ = fVar194 * auVar30._4_4_;
  auVar149._8_4_ = fVar196 * auVar30._8_4_;
  auVar149._12_4_ = fVar198 * auVar30._12_4_;
  local_1a8 = vsubps_avx(auVar44,auVar149);
  auVar31 = vshufps_avx(auVar36,auVar36,0xff);
  auVar131._0_4_ = auVar31._0_4_ * fVar182 + auVar30._0_4_ * fVar202 * auVar32._0_4_ * fVar195;
  auVar131._4_4_ = auVar31._4_4_ * fVar194 + auVar30._4_4_ * fVar202 * auVar32._4_4_ * fVar195;
  auVar131._8_4_ = auVar31._8_4_ * fVar196 + auVar30._8_4_ * fVar202 * auVar32._8_4_ * fVar195;
  auVar131._12_4_ = auVar31._12_4_ * fVar198 + auVar30._12_4_ * fVar202 * auVar32._12_4_ * fVar195;
  auVar32 = vsubps_avx(auVar36,auVar131);
  local_1b8._0_4_ = auVar44._0_4_ + auVar149._0_4_;
  local_1b8._4_4_ = auVar44._4_4_ + auVar149._4_4_;
  fStack_1b0 = auVar44._8_4_ + auVar149._8_4_;
  fStack_1ac = auVar44._12_4_ + auVar149._12_4_;
  auVar30 = vshufps_avx(auVar34,auVar34,0xff);
  auVar132._0_4_ = fVar203 * auVar30._0_4_;
  auVar132._4_4_ = fVar210 * auVar30._4_4_;
  auVar132._8_4_ = fVar211 * auVar30._8_4_;
  auVar132._12_4_ = fVar212 * auVar30._12_4_;
  local_1c8 = vsubps_avx(auVar34,auVar132);
  auVar31 = vshufps_avx(auVar39,auVar39,0xff);
  auVar92._0_4_ = fVar203 * auVar31._0_4_ + auVar30._0_4_ * fVar183 * auVar33._0_4_ * fVar197;
  auVar92._4_4_ = fVar210 * auVar31._4_4_ + auVar30._4_4_ * fVar183 * auVar33._4_4_ * fVar197;
  auVar92._8_4_ = fVar211 * auVar31._8_4_ + auVar30._8_4_ * fVar183 * auVar33._8_4_ * fVar197;
  auVar92._12_4_ = fVar212 * auVar31._12_4_ + auVar30._12_4_ * fVar183 * auVar33._12_4_ * fVar197;
  auVar30 = vsubps_avx(auVar39,auVar92);
  _local_1d8 = vaddps_avx512vl(auVar34,auVar132);
  auVar98._0_4_ = auVar32._0_4_ * 0.33333334;
  auVar98._4_4_ = auVar32._4_4_ * 0.33333334;
  auVar98._8_4_ = auVar32._8_4_ * 0.33333334;
  auVar98._12_4_ = auVar32._12_4_ * 0.33333334;
  local_1e8 = vaddps_avx512vl(local_1a8,auVar98);
  auVar99._0_4_ = auVar30._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar30._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar30._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar30._12_4_ * 0.33333334;
  local_1f8 = vsubps_avx512vl(local_1c8,auVar99);
  auVar83._0_4_ = (fVar199 + auVar131._0_4_) * 0.33333334;
  auVar83._4_4_ = (fVar200 + auVar131._4_4_) * 0.33333334;
  auVar83._8_4_ = (fVar201 + auVar131._8_4_) * 0.33333334;
  auVar83._12_4_ = (fVar90 + auVar131._12_4_) * 0.33333334;
  _local_208 = vaddps_avx512vl(_local_1b8,auVar83);
  auVar84._0_4_ = (fVar108 + auVar92._0_4_) * 0.33333334;
  auVar84._4_4_ = (fVar115 + auVar92._4_4_) * 0.33333334;
  auVar84._8_4_ = (fVar116 + auVar92._8_4_) * 0.33333334;
  auVar84._12_4_ = (fVar117 + auVar92._12_4_) * 0.33333334;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  _local_218 = vsubps_avx512vl(_local_1d8,auVar84);
  auVar31 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar93._4_4_ = uVar82;
  auVar93._0_4_ = uVar82;
  auVar93._8_4_ = uVar82;
  auVar93._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar202 = (pre->ray_space).vz.field_0.m128[0];
  fVar183 = (pre->ray_space).vz.field_0.m128[1];
  fVar195 = (pre->ray_space).vz.field_0.m128[2];
  fVar197 = (pre->ray_space).vz.field_0.m128[3];
  auVar85._0_4_ = fVar202 * auVar31._0_4_;
  auVar85._4_4_ = fVar183 * auVar31._4_4_;
  auVar85._8_4_ = fVar195 * auVar31._8_4_;
  auVar85._12_4_ = fVar197 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar3,auVar30);
  auVar41 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar93);
  auVar31 = vsubps_avx512vl(local_1e8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar100._4_4_ = uVar82;
  auVar100._0_4_ = uVar82;
  auVar100._8_4_ = uVar82;
  auVar100._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar94._0_4_ = fVar202 * auVar31._0_4_;
  auVar94._4_4_ = fVar183 * auVar31._4_4_;
  auVar94._8_4_ = fVar195 * auVar31._8_4_;
  auVar94._12_4_ = fVar197 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar30);
  auVar40 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar100);
  auVar31 = vsubps_avx512vl(local_1f8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar150._4_4_ = uVar82;
  auVar150._0_4_ = uVar82;
  auVar150._8_4_ = uVar82;
  auVar150._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar101._0_4_ = fVar202 * auVar31._0_4_;
  auVar101._4_4_ = fVar183 * auVar31._4_4_;
  auVar101._8_4_ = fVar195 * auVar31._8_4_;
  auVar101._12_4_ = fVar197 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar3,auVar30);
  auVar39 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar150);
  auVar31 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar160._4_4_ = uVar82;
  auVar160._0_4_ = uVar82;
  auVar160._8_4_ = uVar82;
  auVar160._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar151._0_4_ = fVar202 * auVar31._0_4_;
  auVar151._4_4_ = fVar183 * auVar31._4_4_;
  auVar151._8_4_ = fVar195 * auVar31._8_4_;
  auVar151._12_4_ = fVar197 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar3,auVar30);
  auVar38 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar160);
  auVar31 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar167._4_4_ = uVar82;
  auVar167._0_4_ = uVar82;
  auVar167._8_4_ = uVar82;
  auVar167._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar161._0_4_ = auVar31._0_4_ * fVar202;
  auVar161._4_4_ = auVar31._4_4_ * fVar183;
  auVar161._8_4_ = auVar31._8_4_ * fVar195;
  auVar161._12_4_ = auVar31._12_4_ * fVar197;
  auVar30 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar3,auVar30);
  auVar35 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar167);
  auVar31 = vsubps_avx512vl(_local_208,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar177._4_4_ = uVar82;
  auVar177._0_4_ = uVar82;
  auVar177._8_4_ = uVar82;
  auVar177._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar168._0_4_ = auVar31._0_4_ * fVar202;
  auVar168._4_4_ = auVar31._4_4_ * fVar183;
  auVar168._8_4_ = auVar31._8_4_ * fVar195;
  auVar168._12_4_ = auVar31._12_4_ * fVar197;
  auVar30 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar3,auVar30);
  auVar44 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar177);
  auVar31 = vsubps_avx512vl(_local_218,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar184._4_4_ = uVar82;
  auVar184._0_4_ = uVar82;
  auVar184._8_4_ = uVar82;
  auVar184._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar178._0_4_ = auVar31._0_4_ * fVar202;
  auVar178._4_4_ = auVar31._4_4_ * fVar183;
  auVar178._8_4_ = auVar31._8_4_ * fVar195;
  auVar178._12_4_ = auVar31._12_4_ * fVar197;
  auVar30 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar3,auVar30);
  auVar34 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar184);
  auVar31 = vsubps_avx512vl(_local_1d8,(undefined1  [16])aVar1);
  uVar82 = auVar31._0_4_;
  auVar185._4_4_ = uVar82;
  auVar185._0_4_ = uVar82;
  auVar185._8_4_ = uVar82;
  auVar185._12_4_ = uVar82;
  auVar30 = vshufps_avx(auVar31,auVar31,0x55);
  auVar31 = vshufps_avx(auVar31,auVar31,0xaa);
  auVar122._0_4_ = fVar202 * auVar31._0_4_;
  auVar122._4_4_ = fVar183 * auVar31._4_4_;
  auVar122._8_4_ = fVar195 * auVar31._8_4_;
  auVar122._12_4_ = fVar197 * auVar31._12_4_;
  auVar30 = vfmadd231ps_fma(auVar122,(undefined1  [16])aVar3,auVar30);
  auVar36 = vfmadd231ps_fma(auVar30,(undefined1  [16])aVar2,auVar185);
  local_2f8 = vmovlhps_avx512f(auVar41,auVar35);
  auVar238 = ZEXT1664(local_2f8);
  local_258 = vmovlhps_avx(auVar40,auVar44);
  local_268 = vmovlhps_avx512f(auVar39,auVar34);
  _local_f8 = vmovlhps_avx512f(auVar38,auVar36);
  auVar30 = vminps_avx512vl(local_2f8,local_258);
  auVar32 = vmaxps_avx512vl(local_2f8,local_258);
  auVar31 = vminps_avx512vl(local_268,_local_f8);
  auVar31 = vminps_avx(auVar30,auVar31);
  auVar30 = vmaxps_avx512vl(local_268,_local_f8);
  auVar30 = vmaxps_avx(auVar32,auVar30);
  auVar32 = vshufpd_avx(auVar31,auVar31,3);
  auVar33 = vshufpd_avx(auVar30,auVar30,3);
  auVar31 = vminps_avx(auVar31,auVar32);
  auVar30 = vmaxps_avx(auVar30,auVar33);
  auVar31 = vandps_avx512vl(auVar31,auVar235._0_16_);
  auVar30 = vandps_avx512vl(auVar30,auVar235._0_16_);
  auVar30 = vmaxps_avx(auVar31,auVar30);
  auVar31 = vmovshdup_avx(auVar30);
  auVar30 = vmaxss_avx(auVar31,auVar30);
  local_278._8_8_ = auVar41._0_8_;
  local_278._0_8_ = auVar41._0_8_;
  local_288 = vmovddup_avx512vl(auVar40);
  local_298 = vmovddup_avx512vl(auVar39);
  local_2a8._0_8_ = auVar38._0_8_;
  local_2a8._8_8_ = local_2a8._0_8_;
  register0x00001348 = auVar35._0_8_;
  local_2b8 = auVar35._0_8_;
  register0x00001388 = auVar44._0_8_;
  local_2c8 = auVar44._0_8_;
  register0x00001408 = auVar34._0_8_;
  local_2d8 = auVar34._0_8_;
  register0x00001448 = auVar36._0_8_;
  local_2e8 = auVar36._0_8_;
  local_108 = ZEXT416((uint)(auVar30._0_4_ * 9.536743e-07));
  local_b8 = vbroadcastss_avx512vl(local_108);
  auVar30 = vxorps_avx512vl(local_b8._0_16_,auVar231._0_16_);
  local_78 = auVar30._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_c8 = vsubps_avx512vl(local_258,local_2f8);
  local_d8 = vsubps_avx512vl(local_268,local_258);
  local_e8 = vsubps_avx512vl(_local_f8,local_268);
  local_118 = vsubps_avx(_local_1b8,local_1a8);
  local_128 = vsubps_avx512vl(_local_208,local_1e8);
  local_138 = vsubps_avx512vl(_local_218,local_1f8);
  _local_148 = vsubps_avx512vl(_local_1d8,local_1c8);
  uVar19 = 0;
  auVar30 = ZEXT816(0x3f80000000000000);
  auVar95 = auVar30;
LAB_017a4121:
  auVar237 = ZEXT3264(local_b8);
  auVar31 = vshufps_avx(auVar95,auVar95,0x50);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar223._16_4_ = 0x3f800000;
  auVar223._0_16_ = auVar220;
  auVar223._20_4_ = 0x3f800000;
  auVar223._24_4_ = 0x3f800000;
  auVar223._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar220,auVar31);
  fVar202 = auVar31._0_4_;
  auVar123._0_4_ = local_2b8._0_4_ * fVar202;
  fVar183 = auVar31._4_4_;
  auVar123._4_4_ = local_2b8._4_4_ * fVar183;
  fVar195 = auVar31._8_4_;
  auVar123._8_4_ = local_2b8._8_4_ * fVar195;
  fVar197 = auVar31._12_4_;
  auVar123._12_4_ = local_2b8._12_4_ * fVar197;
  auVar133._0_4_ = local_2c8._0_4_ * fVar202;
  auVar133._4_4_ = local_2c8._4_4_ * fVar183;
  auVar133._8_4_ = local_2c8._8_4_ * fVar195;
  auVar133._12_4_ = local_2c8._12_4_ * fVar197;
  auVar143._0_4_ = local_2d8._0_4_ * fVar202;
  auVar143._4_4_ = local_2d8._4_4_ * fVar183;
  auVar143._8_4_ = local_2d8._8_4_ * fVar195;
  auVar143._12_4_ = local_2d8._12_4_ * fVar197;
  auVar102._0_4_ = local_2e8._0_4_ * fVar202;
  auVar102._4_4_ = local_2e8._4_4_ * fVar183;
  auVar102._8_4_ = local_2e8._8_4_ * fVar195;
  auVar102._12_4_ = local_2e8._12_4_ * fVar197;
  auVar33 = vfmadd231ps_fma(auVar123,auVar32,local_278);
  auVar41 = vfmadd231ps_avx512vl(auVar133,auVar32,local_288);
  auVar40 = vfmadd231ps_avx512vl(auVar143,auVar32,local_298);
  auVar32 = vfmadd231ps_fma(auVar102,local_2a8,auVar32);
  auVar31 = vmovshdup_avx(auVar30);
  fVar183 = auVar30._0_4_;
  fVar202 = (auVar31._0_4_ - fVar183) * 0.04761905;
  auVar63._4_4_ = fVar183;
  auVar63._0_4_ = fVar183;
  auVar63._8_4_ = fVar183;
  auVar63._12_4_ = fVar183;
  auVar63._16_4_ = fVar183;
  auVar63._20_4_ = fVar183;
  auVar63._24_4_ = fVar183;
  auVar63._28_4_ = fVar183;
  auVar58._0_8_ = auVar31._0_8_;
  auVar58._8_8_ = auVar58._0_8_;
  auVar58._16_8_ = auVar58._0_8_;
  auVar58._24_8_ = auVar58._0_8_;
  auVar66 = vsubps_avx(auVar58,auVar63);
  uVar82 = auVar33._0_4_;
  auVar68._4_4_ = uVar82;
  auVar68._0_4_ = uVar82;
  auVar68._8_4_ = uVar82;
  auVar68._12_4_ = uVar82;
  auVar68._16_4_ = uVar82;
  auVar68._20_4_ = uVar82;
  auVar68._24_4_ = uVar82;
  auVar68._28_4_ = uVar82;
  auVar126._8_4_ = 1;
  auVar126._0_8_ = 0x100000001;
  auVar126._12_4_ = 1;
  auVar126._16_4_ = 1;
  auVar126._20_4_ = 1;
  auVar126._24_4_ = 1;
  auVar126._28_4_ = 1;
  auVar65 = ZEXT1632(auVar33);
  auVar64 = vpermps_avx2(auVar126,auVar65);
  auVar49 = vbroadcastss_avx512vl(auVar41);
  auVar59 = ZEXT1632(auVar41);
  auVar50 = vpermps_avx512vl(auVar126,auVar59);
  auVar51 = vbroadcastss_avx512vl(auVar40);
  auVar60 = ZEXT1632(auVar40);
  auVar52 = vpermps_avx512vl(auVar126,auVar60);
  auVar53 = vbroadcastss_avx512vl(auVar32);
  auVar62 = ZEXT1632(auVar32);
  auVar54 = vpermps_avx512vl(auVar126,auVar62);
  auVar139._4_4_ = fVar202;
  auVar139._0_4_ = fVar202;
  auVar139._8_4_ = fVar202;
  auVar139._12_4_ = fVar202;
  auVar139._16_4_ = fVar202;
  auVar139._20_4_ = fVar202;
  auVar139._24_4_ = fVar202;
  auVar139._28_4_ = fVar202;
  auVar61._8_4_ = 2;
  auVar61._0_8_ = 0x200000002;
  auVar61._12_4_ = 2;
  auVar61._16_4_ = 2;
  auVar61._20_4_ = 2;
  auVar61._24_4_ = 2;
  auVar61._28_4_ = 2;
  auVar55 = vpermps_avx512vl(auVar61,auVar65);
  auVar56 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar57 = vpermps_avx512vl(auVar56,auVar65);
  auVar58 = vpermps_avx512vl(auVar61,auVar59);
  auVar59 = vpermps_avx512vl(auVar56,auVar59);
  auVar65 = vpermps_avx2(auVar61,auVar60);
  auVar60 = vpermps_avx512vl(auVar56,auVar60);
  auVar61 = vpermps_avx512vl(auVar61,auVar62);
  auVar62 = vpermps_avx512vl(auVar56,auVar62);
  auVar31 = vfmadd132ps_fma(auVar66,auVar63,_DAT_01f7b040);
  auVar66 = vsubps_avx(auVar223,ZEXT1632(auVar31));
  auVar56 = vmulps_avx512vl(auVar49,ZEXT1632(auVar31));
  auVar67 = ZEXT1632(auVar31);
  auVar63 = vmulps_avx512vl(auVar50,auVar67);
  auVar32 = vfmadd231ps_fma(auVar56,auVar66,auVar68);
  auVar33 = vfmadd231ps_fma(auVar63,auVar66,auVar64);
  auVar56 = vmulps_avx512vl(auVar51,auVar67);
  auVar63 = vmulps_avx512vl(auVar52,auVar67);
  auVar49 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar49);
  auVar50 = vfmadd231ps_avx512vl(auVar63,auVar66,auVar50);
  auVar56 = vmulps_avx512vl(auVar53,auVar67);
  auVar68 = ZEXT1632(auVar31);
  auVar54 = vmulps_avx512vl(auVar54,auVar68);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar51);
  auVar63 = vfmadd231ps_avx512vl(auVar54,auVar66,auVar52);
  fVar195 = auVar31._0_4_;
  fVar197 = auVar31._4_4_;
  auVar51._4_4_ = fVar197 * auVar49._4_4_;
  auVar51._0_4_ = fVar195 * auVar49._0_4_;
  fVar199 = auVar31._8_4_;
  auVar51._8_4_ = fVar199 * auVar49._8_4_;
  fVar200 = auVar31._12_4_;
  auVar51._12_4_ = fVar200 * auVar49._12_4_;
  auVar51._16_4_ = auVar49._16_4_ * 0.0;
  auVar51._20_4_ = auVar49._20_4_ * 0.0;
  auVar51._24_4_ = auVar49._24_4_ * 0.0;
  auVar51._28_4_ = fVar183;
  auVar52._4_4_ = fVar197 * auVar50._4_4_;
  auVar52._0_4_ = fVar195 * auVar50._0_4_;
  auVar52._8_4_ = fVar199 * auVar50._8_4_;
  auVar52._12_4_ = fVar200 * auVar50._12_4_;
  auVar52._16_4_ = auVar50._16_4_ * 0.0;
  auVar52._20_4_ = auVar50._20_4_ * 0.0;
  auVar52._24_4_ = auVar50._24_4_ * 0.0;
  auVar52._28_4_ = auVar64._28_4_;
  auVar32 = vfmadd231ps_fma(auVar51,auVar66,ZEXT1632(auVar32));
  auVar33 = vfmadd231ps_fma(auVar52,auVar66,ZEXT1632(auVar33));
  auVar67._0_4_ = fVar195 * auVar56._0_4_;
  auVar67._4_4_ = fVar197 * auVar56._4_4_;
  auVar67._8_4_ = fVar199 * auVar56._8_4_;
  auVar67._12_4_ = fVar200 * auVar56._12_4_;
  auVar67._16_4_ = auVar56._16_4_ * 0.0;
  auVar67._20_4_ = auVar56._20_4_ * 0.0;
  auVar67._24_4_ = auVar56._24_4_ * 0.0;
  auVar67._28_4_ = 0;
  auVar54._4_4_ = fVar197 * auVar63._4_4_;
  auVar54._0_4_ = fVar195 * auVar63._0_4_;
  auVar54._8_4_ = fVar199 * auVar63._8_4_;
  auVar54._12_4_ = fVar200 * auVar63._12_4_;
  auVar54._16_4_ = auVar63._16_4_ * 0.0;
  auVar54._20_4_ = auVar63._20_4_ * 0.0;
  auVar54._24_4_ = auVar63._24_4_ * 0.0;
  auVar54._28_4_ = auVar56._28_4_;
  auVar41 = vfmadd231ps_fma(auVar67,auVar66,auVar49);
  auVar40 = vfmadd231ps_fma(auVar54,auVar66,auVar50);
  auVar56._28_4_ = auVar50._28_4_;
  auVar56._0_28_ =
       ZEXT1628(CONCAT412(fVar200 * auVar40._12_4_,
                          CONCAT48(fVar199 * auVar40._8_4_,
                                   CONCAT44(fVar197 * auVar40._4_4_,fVar195 * auVar40._0_4_))));
  auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar200 * auVar41._12_4_,
                                               CONCAT48(fVar199 * auVar41._8_4_,
                                                        CONCAT44(fVar197 * auVar41._4_4_,
                                                                 fVar195 * auVar41._0_4_)))),auVar66
                            ,ZEXT1632(auVar32));
  auVar38 = vfmadd231ps_fma(auVar56,auVar66,ZEXT1632(auVar33));
  auVar64 = vsubps_avx(ZEXT1632(auVar41),ZEXT1632(auVar32));
  auVar49 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar33));
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar64 = vmulps_avx512vl(auVar64,auVar50);
  auVar49 = vmulps_avx512vl(auVar49,auVar50);
  auVar69._0_4_ = fVar202 * auVar64._0_4_;
  auVar69._4_4_ = fVar202 * auVar64._4_4_;
  auVar69._8_4_ = fVar202 * auVar64._8_4_;
  auVar69._12_4_ = fVar202 * auVar64._12_4_;
  auVar69._16_4_ = fVar202 * auVar64._16_4_;
  auVar69._20_4_ = fVar202 * auVar64._20_4_;
  auVar69._24_4_ = fVar202 * auVar64._24_4_;
  auVar69._28_4_ = 0;
  auVar64 = vmulps_avx512vl(auVar139,auVar49);
  auVar33 = vxorps_avx512vl(auVar53._0_16_,auVar53._0_16_);
  auVar49 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01fb9fc0,ZEXT1632(auVar33));
  auVar51 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_01fb9fc0,ZEXT1632(auVar33));
  auVar107._0_4_ = auVar69._0_4_ + auVar39._0_4_;
  auVar107._4_4_ = auVar69._4_4_ + auVar39._4_4_;
  auVar107._8_4_ = auVar69._8_4_ + auVar39._8_4_;
  auVar107._12_4_ = auVar69._12_4_ + auVar39._12_4_;
  auVar107._16_4_ = auVar69._16_4_ + 0.0;
  auVar107._20_4_ = auVar69._20_4_ + 0.0;
  auVar107._24_4_ = auVar69._24_4_ + 0.0;
  auVar107._28_4_ = 0;
  auVar63 = ZEXT1632(auVar33);
  auVar52 = vpermt2ps_avx512vl(auVar69,_DAT_01fb9fc0,auVar63);
  auVar54 = vaddps_avx512vl(ZEXT1632(auVar38),auVar64);
  auVar56 = vpermt2ps_avx512vl(auVar64,_DAT_01fb9fc0,auVar63);
  auVar64 = vsubps_avx(auVar49,auVar52);
  auVar52 = vsubps_avx512vl(auVar51,auVar56);
  auVar56 = vmulps_avx512vl(auVar58,auVar68);
  auVar53 = vmulps_avx512vl(auVar59,auVar68);
  auVar56 = vfmadd231ps_avx512vl(auVar56,auVar66,auVar55);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar57);
  auVar55 = vmulps_avx512vl(auVar65,auVar68);
  auVar57 = vmulps_avx512vl(auVar60,auVar68);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar66,auVar58);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar66,auVar59);
  auVar58 = vmulps_avx512vl(auVar61,auVar68);
  auVar59 = vmulps_avx512vl(auVar62,auVar68);
  auVar32 = vfmadd231ps_fma(auVar58,auVar66,auVar65);
  auVar65 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar60);
  auVar58 = vmulps_avx512vl(auVar68,auVar55);
  auVar61 = ZEXT1632(auVar31);
  auVar59 = vmulps_avx512vl(auVar61,auVar57);
  auVar56 = vfmadd231ps_avx512vl(auVar58,auVar66,auVar56);
  auVar58 = vfmadd231ps_avx512vl(auVar59,auVar66,auVar53);
  auVar65 = vmulps_avx512vl(auVar61,auVar65);
  auVar55 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar200 * auVar32._12_4_,
                                          CONCAT48(fVar199 * auVar32._8_4_,
                                                   CONCAT44(fVar197 * auVar32._4_4_,
                                                            fVar195 * auVar32._0_4_)))),auVar66,
                       auVar55);
  auVar65 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar57);
  auVar53._4_4_ = fVar197 * auVar55._4_4_;
  auVar53._0_4_ = fVar195 * auVar55._0_4_;
  auVar53._8_4_ = fVar199 * auVar55._8_4_;
  auVar53._12_4_ = fVar200 * auVar55._12_4_;
  auVar53._16_4_ = auVar55._16_4_ * 0.0;
  auVar53._20_4_ = auVar55._20_4_ * 0.0;
  auVar53._24_4_ = auVar55._24_4_ * 0.0;
  auVar53._28_4_ = auVar60._28_4_;
  auVar57 = vmulps_avx512vl(auVar61,auVar65);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar66,auVar56);
  auVar59 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar66);
  auVar66 = vsubps_avx512vl(auVar55,auVar56);
  auVar65 = vsubps_avx512vl(auVar65,auVar58);
  auVar66 = vmulps_avx512vl(auVar66,auVar50);
  auVar65 = vmulps_avx512vl(auVar65,auVar50);
  fVar183 = fVar202 * auVar66._0_4_;
  fVar195 = fVar202 * auVar66._4_4_;
  auVar55._4_4_ = fVar195;
  auVar55._0_4_ = fVar183;
  fVar197 = fVar202 * auVar66._8_4_;
  auVar55._8_4_ = fVar197;
  fVar199 = fVar202 * auVar66._12_4_;
  auVar55._12_4_ = fVar199;
  fVar200 = fVar202 * auVar66._16_4_;
  auVar55._16_4_ = fVar200;
  fVar201 = fVar202 * auVar66._20_4_;
  auVar55._20_4_ = fVar201;
  fVar202 = fVar202 * auVar66._24_4_;
  auVar55._24_4_ = fVar202;
  auVar55._28_4_ = auVar66._28_4_;
  auVar65 = vmulps_avx512vl(auVar139,auVar65);
  auVar50 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,auVar63);
  auVar56 = vpermt2ps_avx512vl(auVar59,_DAT_01fb9fc0,auVar63);
  auVar181._0_4_ = auVar53._0_4_ + fVar183;
  auVar181._4_4_ = auVar53._4_4_ + fVar195;
  auVar181._8_4_ = auVar53._8_4_ + fVar197;
  auVar181._12_4_ = auVar53._12_4_ + fVar199;
  auVar181._16_4_ = auVar53._16_4_ + fVar200;
  auVar181._20_4_ = auVar53._20_4_ + fVar201;
  auVar181._24_4_ = auVar53._24_4_ + fVar202;
  auVar181._28_4_ = auVar53._28_4_ + auVar66._28_4_;
  auVar66 = vpermt2ps_avx512vl(auVar55,_DAT_01fb9fc0,ZEXT1632(auVar33));
  auVar55 = vaddps_avx512vl(auVar59,auVar65);
  auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01fb9fc0,ZEXT1632(auVar33));
  auVar66 = vsubps_avx(auVar50,auVar66);
  auVar65 = vsubps_avx512vl(auVar56,auVar65);
  in_ZMM17 = ZEXT3264(auVar65);
  auVar126 = ZEXT1632(auVar39);
  auVar57 = vsubps_avx512vl(auVar53,auVar126);
  auVar139 = ZEXT1632(auVar38);
  auVar58 = vsubps_avx512vl(auVar59,auVar139);
  auVar60 = vsubps_avx512vl(auVar50,auVar49);
  auVar57 = vaddps_avx512vl(auVar57,auVar60);
  auVar60 = vsubps_avx512vl(auVar56,auVar51);
  auVar58 = vaddps_avx512vl(auVar58,auVar60);
  auVar60 = vmulps_avx512vl(auVar139,auVar57);
  auVar60 = vfnmadd231ps_avx512vl(auVar60,auVar126,auVar58);
  auVar61 = vmulps_avx512vl(auVar54,auVar57);
  auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar107,auVar58);
  auVar62 = vmulps_avx512vl(auVar52,auVar57);
  auVar62 = vfnmadd231ps_avx512vl(auVar62,auVar64,auVar58);
  auVar63 = vmulps_avx512vl(auVar51,auVar57);
  auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar49,auVar58);
  auVar67 = vmulps_avx512vl(auVar59,auVar57);
  auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar53,auVar58);
  auVar68 = vmulps_avx512vl(auVar55,auVar57);
  auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar181,auVar58);
  auVar69 = vmulps_avx512vl(auVar65,auVar57);
  auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar66,auVar58);
  auVar57 = vmulps_avx512vl(auVar56,auVar57);
  auVar57 = vfnmadd231ps_avx512vl(auVar57,auVar50,auVar58);
  auVar58 = vminps_avx512vl(auVar60,auVar61);
  auVar60 = vmaxps_avx512vl(auVar60,auVar61);
  auVar61 = vminps_avx512vl(auVar62,auVar63);
  auVar58 = vminps_avx512vl(auVar58,auVar61);
  auVar61 = vmaxps_avx512vl(auVar62,auVar63);
  auVar60 = vmaxps_avx512vl(auVar60,auVar61);
  auVar61 = vminps_avx512vl(auVar67,auVar68);
  auVar62 = vmaxps_avx512vl(auVar67,auVar68);
  auVar63 = vminps_avx512vl(auVar69,auVar57);
  auVar61 = vminps_avx512vl(auVar61,auVar63);
  auVar58 = vminps_avx512vl(auVar58,auVar61);
  auVar57 = vmaxps_avx512vl(auVar69,auVar57);
  auVar57 = vmaxps_avx512vl(auVar62,auVar57);
  auVar60 = vmaxps_avx512vl(auVar60,auVar57);
  uVar10 = vcmpps_avx512vl(auVar58,local_b8,2);
  auVar57._4_4_ = uStack_74;
  auVar57._0_4_ = local_78;
  auVar57._8_4_ = uStack_70;
  auVar57._12_4_ = uStack_6c;
  auVar57._16_4_ = uStack_68;
  auVar57._20_4_ = uStack_64;
  auVar57._24_4_ = uStack_60;
  auVar57._28_4_ = uStack_5c;
  uVar11 = vcmpps_avx512vl(auVar60,auVar57,5);
  bVar17 = (byte)uVar10 & (byte)uVar11 & 0x7f;
  if (bVar17 != 0) {
    auVar58 = vsubps_avx512vl(auVar49,auVar126);
    auVar60 = vsubps_avx512vl(auVar51,auVar139);
    auVar61 = vsubps_avx512vl(auVar50,auVar53);
    auVar58 = vaddps_avx512vl(auVar58,auVar61);
    auVar61 = vsubps_avx512vl(auVar56,auVar59);
    auVar60 = vaddps_avx512vl(auVar60,auVar61);
    auVar61 = vmulps_avx512vl(auVar139,auVar58);
    auVar61 = vfnmadd231ps_avx512vl(auVar61,auVar60,auVar126);
    auVar54 = vmulps_avx512vl(auVar54,auVar58);
    auVar54 = vfnmadd213ps_avx512vl(auVar107,auVar60,auVar54);
    auVar52 = vmulps_avx512vl(auVar52,auVar58);
    auVar52 = vfnmadd213ps_avx512vl(auVar64,auVar60,auVar52);
    auVar64 = vmulps_avx512vl(auVar51,auVar58);
    auVar51 = vfnmadd231ps_avx512vl(auVar64,auVar60,auVar49);
    auVar64 = vmulps_avx512vl(auVar59,auVar58);
    auVar53 = vfnmadd231ps_avx512vl(auVar64,auVar60,auVar53);
    auVar64 = vmulps_avx512vl(auVar55,auVar58);
    auVar55 = vfnmadd213ps_avx512vl(auVar181,auVar60,auVar64);
    auVar64 = vmulps_avx512vl(auVar65,auVar58);
    auVar59 = vfnmadd213ps_avx512vl(auVar66,auVar60,auVar64);
    auVar66 = vmulps_avx512vl(auVar56,auVar58);
    auVar56 = vfnmadd231ps_avx512vl(auVar66,auVar50,auVar60);
    auVar64 = vminps_avx(auVar61,auVar54);
    auVar66 = vmaxps_avx(auVar61,auVar54);
    auVar49 = vminps_avx(auVar52,auVar51);
    auVar49 = vminps_avx(auVar64,auVar49);
    auVar64 = vmaxps_avx(auVar52,auVar51);
    auVar66 = vmaxps_avx(auVar66,auVar64);
    auVar65 = vminps_avx(auVar53,auVar55);
    auVar64 = vmaxps_avx(auVar53,auVar55);
    auVar50 = vminps_avx(auVar59,auVar56);
    auVar65 = vminps_avx(auVar65,auVar50);
    auVar65 = vminps_avx(auVar49,auVar65);
    auVar49 = vmaxps_avx(auVar59,auVar56);
    auVar64 = vmaxps_avx(auVar64,auVar49);
    auVar66 = vmaxps_avx(auVar66,auVar64);
    uVar10 = vcmpps_avx512vl(auVar66,auVar57,5);
    uVar11 = vcmpps_avx512vl(auVar65,local_b8,2);
    bVar17 = bVar17 & (byte)uVar10 & (byte)uVar11;
    if (bVar17 != 0) {
      auStack_198[uVar19] = (uint)bVar17;
      uVar10 = vmovlps_avx(auVar30);
      (&uStack_98)[uVar19] = uVar10;
      uVar25 = vmovlps_avx(auVar95);
      auStack_58[uVar19] = uVar25;
      uVar19 = (ulong)((int)uVar19 + 1);
    }
  }
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar230 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar231 = ZEXT1664(auVar30);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar232 = ZEXT3264(auVar66);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar233 = ZEXT1664(auVar30);
  auVar234 = ZEXT3264(_DAT_01fb9fe0);
  auVar66 = _DAT_01fb9fe0;
LAB_017a461f:
  do {
    do {
      do {
        auVar31 = auVar236._0_16_;
        if ((int)uVar19 == 0) {
          fVar202 = (ray->super_RayK<1>).tfar;
          auVar15._4_4_ = fVar202;
          auVar15._0_4_ = fVar202;
          auVar15._8_4_ = fVar202;
          auVar15._12_4_ = fVar202;
          uVar10 = vcmpps_avx512vl(local_158,auVar15,2);
          uVar24 = (ulong)((uint)uVar24 & (uint)uVar10);
          goto LAB_017a3a5e;
        }
        uVar18 = (int)uVar19 - 1;
        uVar20 = (ulong)uVar18;
        uVar5 = auStack_198[uVar20];
        auVar95._8_8_ = 0;
        auVar95._0_8_ = auStack_58[uVar20];
        uVar25 = 0;
        for (uVar23 = (ulong)uVar5; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          uVar25 = uVar25 + 1;
        }
        uVar22 = uVar5 - 1 & uVar5;
        bVar28 = uVar22 == 0;
        auStack_198[uVar20] = uVar22;
        if (bVar28) {
          uVar19 = (ulong)uVar18;
        }
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar25;
        auVar30 = vpunpcklqdq_avx(auVar86,ZEXT416((int)uVar25 + 1));
        auVar30 = vcvtqq2ps_avx512vl(auVar30);
        auVar30 = vmulps_avx512vl(auVar30,auVar233._0_16_);
        uVar82 = *(undefined4 *)((long)&uStack_98 + uVar20 * 8 + 4);
        auVar12._4_4_ = uVar82;
        auVar12._0_4_ = uVar82;
        auVar12._8_4_ = uVar82;
        auVar12._12_4_ = uVar82;
        auVar32 = vmulps_avx512vl(auVar30,auVar12);
        auVar30 = vsubps_avx512vl(auVar31,auVar30);
        uVar82 = *(undefined4 *)(&uStack_98 + uVar20);
        auVar13._4_4_ = uVar82;
        auVar13._0_4_ = uVar82;
        auVar13._8_4_ = uVar82;
        auVar13._12_4_ = uVar82;
        auVar30 = vfmadd231ps_avx512vl(auVar32,auVar30,auVar13);
        auVar32 = vmovshdup_avx(auVar30);
        fVar202 = auVar32._0_4_ - auVar30._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        if (uVar5 == 0 || bVar28) goto LAB_017a4121;
        auVar32 = vshufps_avx(auVar95,auVar95,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar202));
        auVar40 = vsubps_avx512vl(auVar31,auVar32);
        fVar183 = auVar32._0_4_;
        auVar134._0_4_ = fVar183 * (float)local_2b8._0_4_;
        fVar195 = auVar32._4_4_;
        auVar134._4_4_ = fVar195 * (float)local_2b8._4_4_;
        fVar197 = auVar32._8_4_;
        auVar134._8_4_ = fVar197 * fStack_2b0;
        fVar199 = auVar32._12_4_;
        auVar134._12_4_ = fVar199 * fStack_2ac;
        auVar144._0_4_ = fVar183 * (float)local_2c8._0_4_;
        auVar144._4_4_ = fVar195 * (float)local_2c8._4_4_;
        auVar144._8_4_ = fVar197 * fStack_2c0;
        auVar144._12_4_ = fVar199 * fStack_2bc;
        auVar152._0_4_ = fVar183 * (float)local_2d8._0_4_;
        auVar152._4_4_ = fVar195 * (float)local_2d8._4_4_;
        auVar152._8_4_ = fVar197 * fStack_2d0;
        auVar152._12_4_ = fVar199 * fStack_2cc;
        auVar111._0_4_ = fVar183 * (float)local_2e8._0_4_;
        auVar111._4_4_ = fVar195 * (float)local_2e8._4_4_;
        auVar111._8_4_ = fVar197 * fStack_2e0;
        auVar111._12_4_ = fVar199 * fStack_2dc;
        auVar32 = vfmadd231ps_fma(auVar134,auVar40,local_278);
        auVar33 = vfmadd231ps_fma(auVar144,auVar40,local_288);
        auVar41 = vfmadd231ps_fma(auVar152,auVar40,local_298);
        auVar40 = vfmadd231ps_fma(auVar111,auVar40,local_2a8);
        auVar59._16_16_ = auVar32;
        auVar59._0_16_ = auVar32;
        auVar60._16_16_ = auVar33;
        auVar60._0_16_ = auVar33;
        auVar148._16_16_ = auVar41;
        auVar148._0_16_ = auVar41;
        auVar64 = vpermps_avx512vl(auVar234._0_32_,ZEXT1632(auVar30));
        auVar66 = vsubps_avx(auVar60,auVar59);
        auVar33 = vfmadd213ps_fma(auVar66,auVar64,auVar59);
        auVar66 = vsubps_avx(auVar148,auVar60);
        auVar39 = vfmadd213ps_fma(auVar66,auVar64,auVar60);
        auVar32 = vsubps_avx(auVar40,auVar41);
        auVar62._16_16_ = auVar32;
        auVar62._0_16_ = auVar32;
        auVar32 = vfmadd213ps_fma(auVar62,auVar64,auVar148);
        auVar66 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar33));
        auVar33 = vfmadd213ps_fma(auVar66,auVar64,ZEXT1632(auVar33));
        auVar66 = vsubps_avx(ZEXT1632(auVar32),ZEXT1632(auVar39));
        auVar32 = vfmadd213ps_fma(auVar66,auVar64,ZEXT1632(auVar39));
        auVar66 = vsubps_avx(ZEXT1632(auVar32),ZEXT1632(auVar33));
        auVar45 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar66,auVar64);
        auVar66 = vmulps_avx512vl(auVar66,auVar232._0_32_);
        auVar32 = vmulss_avx512f(ZEXT416((uint)fVar202),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar183 = auVar32._0_4_;
        auVar153._0_8_ =
             CONCAT44(auVar45._4_4_ + fVar183 * auVar66._4_4_,
                      auVar45._0_4_ + fVar183 * auVar66._0_4_);
        auVar153._8_4_ = auVar45._8_4_ + fVar183 * auVar66._8_4_;
        auVar153._12_4_ = auVar45._12_4_ + fVar183 * auVar66._12_4_;
        auVar135._0_4_ = fVar183 * auVar66._16_4_;
        auVar135._4_4_ = fVar183 * auVar66._20_4_;
        auVar135._8_4_ = fVar183 * auVar66._24_4_;
        auVar135._12_4_ = fVar183 * auVar66._28_4_;
        auVar34 = vsubps_avx((undefined1  [16])0x0,auVar135);
        auVar39 = vshufpd_avx(auVar45,auVar45,3);
        auVar38 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar32 = vsubps_avx(auVar39,auVar45);
        auVar33 = vsubps_avx(auVar38,(undefined1  [16])0x0);
        auVar169._0_4_ = auVar32._0_4_ + auVar33._0_4_;
        auVar169._4_4_ = auVar32._4_4_ + auVar33._4_4_;
        auVar169._8_4_ = auVar32._8_4_ + auVar33._8_4_;
        auVar169._12_4_ = auVar32._12_4_ + auVar33._12_4_;
        auVar32 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar33 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar41 = vshufps_avx(auVar34,auVar34,0xb1);
        auVar40 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar221._4_4_ = auVar169._0_4_;
        auVar221._0_4_ = auVar169._0_4_;
        auVar221._8_4_ = auVar169._0_4_;
        auVar221._12_4_ = auVar169._0_4_;
        auVar35 = vshufps_avx(auVar169,auVar169,0x55);
        fVar183 = auVar35._0_4_;
        auVar179._0_4_ = auVar32._0_4_ * fVar183;
        fVar195 = auVar35._4_4_;
        auVar179._4_4_ = auVar32._4_4_ * fVar195;
        fVar197 = auVar35._8_4_;
        auVar179._8_4_ = auVar32._8_4_ * fVar197;
        fVar199 = auVar35._12_4_;
        auVar179._12_4_ = auVar32._12_4_ * fVar199;
        auVar186._0_4_ = auVar33._0_4_ * fVar183;
        auVar186._4_4_ = auVar33._4_4_ * fVar195;
        auVar186._8_4_ = auVar33._8_4_ * fVar197;
        auVar186._12_4_ = auVar33._12_4_ * fVar199;
        auVar204._0_4_ = auVar41._0_4_ * fVar183;
        auVar204._4_4_ = auVar41._4_4_ * fVar195;
        auVar204._8_4_ = auVar41._8_4_ * fVar197;
        auVar204._12_4_ = auVar41._12_4_ * fVar199;
        auVar170._0_4_ = auVar40._0_4_ * fVar183;
        auVar170._4_4_ = auVar40._4_4_ * fVar195;
        auVar170._8_4_ = auVar40._8_4_ * fVar197;
        auVar170._12_4_ = auVar40._12_4_ * fVar199;
        auVar32 = vfmadd231ps_fma(auVar179,auVar221,auVar45);
        auVar33 = vfmadd231ps_fma(auVar186,auVar221,auVar153);
        auVar36 = vfmadd231ps_fma(auVar204,auVar221,auVar34);
        auVar37 = vfmadd231ps_fma(auVar170,(undefined1  [16])0x0,auVar221);
        auVar35 = vshufpd_avx(auVar32,auVar32,1);
        auVar44 = vshufpd_avx(auVar33,auVar33,1);
        auVar42 = vshufpd_avx512vl(auVar36,auVar36,1);
        auVar43 = vshufpd_avx512vl(auVar37,auVar37,1);
        in_ZMM17 = ZEXT1664(auVar43);
        auVar41 = vminss_avx(auVar32,auVar33);
        auVar32 = vmaxss_avx(auVar33,auVar32);
        auVar40 = vminss_avx(auVar36,auVar37);
        auVar33 = vmaxss_avx(auVar37,auVar36);
        auVar41 = vminss_avx(auVar41,auVar40);
        auVar32 = vmaxss_avx(auVar33,auVar32);
        auVar40 = vminss_avx(auVar35,auVar44);
        auVar33 = vmaxss_avx(auVar44,auVar35);
        auVar35 = vminss_avx512f(auVar42,auVar43);
        auVar44 = vmaxss_avx512f(auVar43,auVar42);
        auVar33 = vmaxss_avx(auVar44,auVar33);
        auVar66._0_16_ = vminss_avx512f(auVar40,auVar35);
        vucomiss_avx512f(auVar41);
        fVar195 = auVar33._0_4_;
        fVar183 = auVar32._0_4_;
        if (4 < (uint)uVar19) {
          bVar29 = fVar195 == -0.0001;
          bVar26 = NAN(fVar195);
          if (fVar195 <= -0.0001) goto LAB_017a483d;
          break;
        }
LAB_017a483d:
        auVar40 = vucomiss_avx512f(auVar66._0_16_);
        bVar29 = fVar195 <= -0.0001;
        bVar27 = -0.0001 < fVar183;
        bVar26 = bVar29;
        if (!bVar29) break;
        uVar10 = vcmpps_avx512vl(auVar41,auVar40,5);
        uVar11 = vcmpps_avx512vl(auVar66._0_16_,auVar40,5);
        uVar18 = (uint)uVar10 & (uint)uVar11;
        bVar16 = (uVar18 & 1) == 0;
        bVar29 = bVar27 && bVar16;
        bVar26 = bVar27 && (uVar18 & 1) == 0;
      } while (!bVar27 || !bVar16);
      auVar44 = vxorps_avx512vl(auVar238._0_16_,auVar238._0_16_);
      vcmpss_avx512f(auVar41,auVar44,1);
      uVar10 = vcmpss_avx512f(auVar32,auVar44,1);
      bVar27 = (bool)((byte)uVar10 & 1);
      auVar71._16_16_ = auVar66._16_16_;
      auVar71._0_16_ = auVar239._0_16_;
      auVar70._4_28_ = auVar71._4_28_;
      auVar70._0_4_ = (float)((uint)bVar27 * -0x40800000 + (uint)!bVar27 * auVar239._0_4_);
      vucomiss_avx512f(auVar70._0_16_);
      bVar26 = (bool)(!bVar29 | bVar26);
      bVar27 = bVar26 == false;
      auVar73._16_16_ = auVar66._16_16_;
      auVar73._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar72._4_28_ = auVar73._4_28_;
      auVar72._0_4_ = (uint)bVar26 * auVar44._0_4_ + (uint)!bVar26 * 0x7f800000;
      auVar35 = auVar72._0_16_;
      auVar75._16_16_ = auVar66._16_16_;
      auVar75._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar74._4_28_ = auVar75._4_28_;
      auVar74._0_4_ = (uint)bVar26 * auVar44._0_4_ + (uint)!bVar26 * -0x800000;
      auVar40 = auVar74._0_16_;
      auVar36 = vxorps_avx512vl(auVar237._0_16_,auVar237._0_16_);
      auVar237 = ZEXT1664(auVar36);
      uVar10 = vcmpss_avx512f(auVar66._0_16_,auVar44,1);
      bVar29 = (bool)((byte)uVar10 & 1);
      auVar77._16_16_ = auVar66._16_16_;
      auVar77._0_16_ = auVar239._0_16_;
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * auVar239._0_4_);
      auVar44 = vucomiss_avx512f(auVar76._0_16_);
      in_ZMM17 = ZEXT1664(auVar44);
      if ((bVar26) || (bVar27)) {
        auVar44 = vucomiss_avx512f(auVar41);
        if ((bVar26) || (bVar27)) {
          auVar37 = vxorps_avx512vl(auVar41,auVar231._0_16_);
          in_ZMM17 = ZEXT1664(auVar37);
          auVar41 = vsubss_avx512f(auVar44,auVar41);
          auVar41 = vdivss_avx512f(auVar37,auVar41);
          auVar44 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
          auVar44 = vfmadd213ss_avx512f(auVar44,auVar36,auVar41);
          auVar41 = auVar44;
        }
        else {
          auVar41 = vxorps_avx512vl(auVar44,auVar44);
          vucomiss_avx512f(auVar41);
          auVar44 = ZEXT416(0x3f800000);
          if ((bVar26) || (bVar27)) {
            auVar44 = SUB6416(ZEXT464(0xff800000),0);
            auVar41 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar35 = vminss_avx512f(auVar35,auVar41);
        auVar40 = vmaxss_avx(auVar44,auVar40);
      }
      auVar239 = ZEXT464(0x3f800000);
      auVar238 = ZEXT1664(local_2f8);
      uVar10 = vcmpss_avx512f(auVar33,auVar36,1);
      bVar29 = (bool)((byte)uVar10 & 1);
      auVar33 = auVar239._0_16_;
      fVar197 = (float)((uint)bVar29 * -0x40800000 + (uint)!bVar29 * 0x3f800000);
      if ((auVar70._0_4_ != fVar197) || (NAN(auVar70._0_4_) || NAN(fVar197))) {
        if ((fVar195 != fVar183) || (NAN(fVar195) || NAN(fVar183))) {
          auVar32 = vxorps_avx512vl(auVar32,auVar231._0_16_);
          auVar171._0_4_ = auVar32._0_4_ / (fVar195 - fVar183);
          auVar171._4_12_ = auVar32._4_12_;
          auVar32 = vsubss_avx512f(auVar33,auVar171);
          auVar32 = vfmadd213ss_avx512f(auVar32,auVar36,auVar171);
          auVar41 = auVar32;
        }
        else if ((fVar183 != 0.0) ||
                (auVar32 = auVar33, auVar41 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar183))) {
          auVar32 = SUB6416(ZEXT464(0xff800000),0);
          auVar41 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar35 = vminss_avx(auVar35,auVar41);
        auVar40 = vmaxss_avx(auVar32,auVar40);
      }
      bVar29 = auVar76._0_4_ != fVar197;
      auVar32 = vminss_avx512f(auVar35,auVar33);
      auVar79._16_16_ = auVar66._16_16_;
      auVar79._0_16_ = auVar35;
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = (uint)bVar29 * auVar32._0_4_ + (uint)!bVar29 * auVar35._0_4_;
      auVar32 = vmaxss_avx512f(auVar33,auVar40);
      auVar81._16_16_ = auVar66._16_16_;
      auVar81._0_16_ = auVar40;
      auVar80._4_28_ = auVar81._4_28_;
      auVar80._0_4_ = (uint)bVar29 * auVar32._0_4_ + (uint)!bVar29 * auVar40._0_4_;
      auVar32 = vmaxss_avx512f(auVar36,auVar78._0_16_);
      auVar66._0_16_ = vminss_avx512f(auVar80._0_16_,auVar33);
    } while (auVar66._0_4_ < auVar32._0_4_);
    auVar37 = vmaxss_avx512f(auVar36,ZEXT416((uint)(auVar32._0_4_ + -0.1)));
    auVar42 = vminss_avx512f(ZEXT416((uint)(auVar66._0_4_ + 0.1)),auVar33);
    auVar112._0_8_ = auVar45._0_8_;
    auVar112._8_8_ = auVar112._0_8_;
    auVar187._8_8_ = auVar153._0_8_;
    auVar187._0_8_ = auVar153._0_8_;
    auVar205._8_8_ = auVar34._0_8_;
    auVar205._0_8_ = auVar34._0_8_;
    auVar32 = vshufpd_avx(auVar153,auVar153,3);
    auVar41 = vshufpd_avx(auVar34,auVar34,3);
    auVar40 = vshufps_avx(auVar37,auVar42,0);
    auVar34 = vsubps_avx512vl(auVar31,auVar40);
    fVar183 = auVar40._0_4_;
    auVar145._0_4_ = fVar183 * auVar39._0_4_;
    fVar195 = auVar40._4_4_;
    auVar145._4_4_ = fVar195 * auVar39._4_4_;
    fVar197 = auVar40._8_4_;
    auVar145._8_4_ = fVar197 * auVar39._8_4_;
    fVar199 = auVar40._12_4_;
    auVar145._12_4_ = fVar199 * auVar39._12_4_;
    auVar154._0_4_ = fVar183 * auVar32._0_4_;
    auVar154._4_4_ = fVar195 * auVar32._4_4_;
    auVar154._8_4_ = fVar197 * auVar32._8_4_;
    auVar154._12_4_ = fVar199 * auVar32._12_4_;
    auVar225._0_4_ = auVar41._0_4_ * fVar183;
    auVar225._4_4_ = auVar41._4_4_ * fVar195;
    auVar225._8_4_ = auVar41._8_4_ * fVar197;
    auVar225._12_4_ = auVar41._12_4_ * fVar199;
    auVar136._0_4_ = fVar183 * auVar38._0_4_;
    auVar136._4_4_ = fVar195 * auVar38._4_4_;
    auVar136._8_4_ = fVar197 * auVar38._8_4_;
    auVar136._12_4_ = fVar199 * auVar38._12_4_;
    auVar38 = vfmadd231ps_fma(auVar145,auVar34,auVar112);
    auVar35 = vfmadd231ps_fma(auVar154,auVar34,auVar187);
    auVar44 = vfmadd231ps_fma(auVar225,auVar34,auVar205);
    auVar34 = vfmadd231ps_fma(auVar136,auVar34,ZEXT816(0));
    auVar41 = vsubss_avx512f(auVar33,auVar37);
    auVar32 = vmovshdup_avx(auVar95);
    auVar43 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar37._0_4_)),auVar95,auVar41);
    auVar41 = vsubss_avx512f(auVar33,auVar42);
    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar42._0_4_)),auVar95,auVar41);
    auVar37 = vdivss_avx512f(auVar33,ZEXT416((uint)fVar202));
    auVar32 = vsubps_avx(auVar35,auVar38);
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar40 = vmulps_avx512vl(auVar32,auVar45);
    auVar32 = vsubps_avx(auVar44,auVar35);
    auVar39 = vmulps_avx512vl(auVar32,auVar45);
    auVar32 = vsubps_avx(auVar34,auVar44);
    auVar32 = vmulps_avx512vl(auVar32,auVar45);
    auVar41 = vminps_avx(auVar39,auVar32);
    auVar32 = vmaxps_avx(auVar39,auVar32);
    auVar41 = vminps_avx(auVar40,auVar41);
    auVar32 = vmaxps_avx(auVar40,auVar32);
    auVar40 = vshufpd_avx(auVar41,auVar41,3);
    auVar39 = vshufpd_avx(auVar32,auVar32,3);
    auVar41 = vminps_avx(auVar41,auVar40);
    auVar32 = vmaxps_avx(auVar32,auVar39);
    fVar202 = auVar37._0_4_;
    auVar172._0_4_ = auVar41._0_4_ * fVar202;
    auVar172._4_4_ = auVar41._4_4_ * fVar202;
    auVar172._8_4_ = auVar41._8_4_ * fVar202;
    auVar172._12_4_ = auVar41._12_4_ * fVar202;
    auVar162._0_4_ = fVar202 * auVar32._0_4_;
    auVar162._4_4_ = fVar202 * auVar32._4_4_;
    auVar162._8_4_ = fVar202 * auVar32._8_4_;
    auVar162._12_4_ = fVar202 * auVar32._12_4_;
    auVar37 = vdivss_avx512f(auVar33,ZEXT416((uint)(auVar91._0_4_ - auVar43._0_4_)));
    auVar32 = vshufpd_avx(auVar38,auVar38,3);
    auVar41 = vshufpd_avx(auVar35,auVar35,3);
    auVar40 = vshufpd_avx(auVar44,auVar44,3);
    auVar39 = vshufpd_avx(auVar34,auVar34,3);
    auVar32 = vsubps_avx(auVar32,auVar38);
    auVar38 = vsubps_avx(auVar41,auVar35);
    auVar35 = vsubps_avx(auVar40,auVar44);
    auVar39 = vsubps_avx(auVar39,auVar34);
    auVar41 = vminps_avx(auVar32,auVar38);
    auVar32 = vmaxps_avx(auVar32,auVar38);
    auVar40 = vminps_avx(auVar35,auVar39);
    auVar40 = vminps_avx(auVar41,auVar40);
    auVar41 = vmaxps_avx(auVar35,auVar39);
    auVar32 = vmaxps_avx(auVar32,auVar41);
    fVar202 = auVar37._0_4_;
    auVar206._0_4_ = fVar202 * auVar40._0_4_;
    auVar206._4_4_ = fVar202 * auVar40._4_4_;
    auVar206._8_4_ = fVar202 * auVar40._8_4_;
    auVar206._12_4_ = fVar202 * auVar40._12_4_;
    auVar188._0_4_ = fVar202 * auVar32._0_4_;
    auVar188._4_4_ = fVar202 * auVar32._4_4_;
    auVar188._8_4_ = fVar202 * auVar32._8_4_;
    auVar188._12_4_ = fVar202 * auVar32._12_4_;
    auVar39 = vinsertps_avx(auVar30,auVar43,0x10);
    auVar46 = vpermt2ps_avx512vl(auVar30,_DAT_01fb9f90,auVar91);
    auVar96._0_4_ = auVar39._0_4_ + auVar46._0_4_;
    auVar96._4_4_ = auVar39._4_4_ + auVar46._4_4_;
    auVar96._8_4_ = auVar39._8_4_ + auVar46._8_4_;
    auVar96._12_4_ = auVar39._12_4_ + auVar46._12_4_;
    auVar37 = vmulps_avx512vl(auVar96,auVar230._0_16_);
    auVar41 = vshufps_avx(auVar37,auVar37,0x54);
    uVar82 = auVar37._0_4_;
    auVar103._4_4_ = uVar82;
    auVar103._0_4_ = uVar82;
    auVar103._8_4_ = uVar82;
    auVar103._12_4_ = uVar82;
    auVar35 = vfmadd213ps_avx512vl(local_c8,auVar103,local_2f8);
    auVar40 = vfmadd213ps_fma(local_d8,auVar103,local_258);
    auVar38 = vfmadd213ps_fma(local_e8,auVar103,local_268);
    auVar32 = vsubps_avx(auVar40,auVar35);
    auVar35 = vfmadd213ps_fma(auVar32,auVar103,auVar35);
    auVar32 = vsubps_avx(auVar38,auVar40);
    auVar32 = vfmadd213ps_fma(auVar32,auVar103,auVar40);
    auVar32 = vsubps_avx(auVar32,auVar35);
    auVar40 = vfmadd231ps_fma(auVar35,auVar32,auVar103);
    auVar44 = vmulps_avx512vl(auVar32,auVar45);
    auVar216._8_8_ = auVar40._0_8_;
    auVar216._0_8_ = auVar40._0_8_;
    auVar32 = vshufpd_avx(auVar40,auVar40,3);
    auVar40 = vshufps_avx(auVar37,auVar37,0x55);
    auVar38 = vsubps_avx(auVar32,auVar216);
    auVar35 = vfmadd231ps_fma(auVar216,auVar40,auVar38);
    auVar226._8_8_ = auVar44._0_8_;
    auVar226._0_8_ = auVar44._0_8_;
    auVar32 = vshufpd_avx(auVar44,auVar44,3);
    auVar32 = vsubps_avx512vl(auVar32,auVar226);
    auVar32 = vfmadd213ps_avx512vl(auVar32,auVar40,auVar226);
    auVar104._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
    auVar104._8_4_ = auVar38._8_4_ ^ 0x80000000;
    auVar104._12_4_ = auVar38._12_4_ ^ 0x80000000;
    auVar40 = vmovshdup_avx512vl(auVar32);
    auVar227._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
    auVar227._8_4_ = auVar40._8_4_ ^ 0x80000000;
    auVar227._12_4_ = auVar40._12_4_ ^ 0x80000000;
    auVar44 = vmovshdup_avx512vl(auVar38);
    auVar34 = vpermt2ps_avx512vl(auVar227,ZEXT416(5),auVar38);
    auVar238 = ZEXT1664(local_2f8);
    auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar38._0_4_)),auVar32,auVar44);
    auVar38 = vpermt2ps_avx512vl(auVar32,SUB6416(ZEXT464(4),0),auVar104);
    auVar137._0_4_ = auVar40._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar32 = vdivps_avx(auVar34,auVar137);
    auVar47 = vdivps_avx512vl(auVar38,auVar137);
    fVar202 = auVar35._0_4_;
    auVar40 = vshufps_avx(auVar35,auVar35,0x55);
    auVar217._0_4_ = fVar202 * auVar32._0_4_ + auVar40._0_4_ * auVar47._0_4_;
    auVar217._4_4_ = fVar202 * auVar32._4_4_ + auVar40._4_4_ * auVar47._4_4_;
    auVar217._8_4_ = fVar202 * auVar32._8_4_ + auVar40._8_4_ * auVar47._8_4_;
    auVar217._12_4_ = fVar202 * auVar32._12_4_ + auVar40._12_4_ * auVar47._12_4_;
    auVar45 = vsubps_avx(auVar41,auVar217);
    auVar40 = vmovshdup_avx(auVar32);
    auVar41 = vinsertps_avx(auVar172,auVar206,0x1c);
    auVar228._0_4_ = auVar40._0_4_ * auVar41._0_4_;
    auVar228._4_4_ = auVar40._4_4_ * auVar41._4_4_;
    auVar228._8_4_ = auVar40._8_4_ * auVar41._8_4_;
    auVar228._12_4_ = auVar40._12_4_ * auVar41._12_4_;
    auVar42 = vinsertps_avx512f(auVar162,auVar188,0x1c);
    auVar40 = vmulps_avx512vl(auVar40,auVar42);
    auVar34 = vminps_avx512vl(auVar228,auVar40);
    auVar35 = vmaxps_avx(auVar40,auVar228);
    auVar44 = vmovshdup_avx(auVar47);
    auVar40 = vinsertps_avx(auVar206,auVar172,0x4c);
    auVar207._0_4_ = auVar44._0_4_ * auVar40._0_4_;
    auVar207._4_4_ = auVar44._4_4_ * auVar40._4_4_;
    auVar207._8_4_ = auVar44._8_4_ * auVar40._8_4_;
    auVar207._12_4_ = auVar44._12_4_ * auVar40._12_4_;
    auVar38 = vinsertps_avx(auVar188,auVar162,0x4c);
    auVar189._0_4_ = auVar44._0_4_ * auVar38._0_4_;
    auVar189._4_4_ = auVar44._4_4_ * auVar38._4_4_;
    auVar189._8_4_ = auVar44._8_4_ * auVar38._8_4_;
    auVar189._12_4_ = auVar44._12_4_ * auVar38._12_4_;
    auVar44 = vminps_avx(auVar207,auVar189);
    auVar34 = vaddps_avx512vl(auVar34,auVar44);
    auVar44 = vmaxps_avx(auVar189,auVar207);
    auVar190._0_4_ = auVar35._0_4_ + auVar44._0_4_;
    auVar190._4_4_ = auVar35._4_4_ + auVar44._4_4_;
    auVar190._8_4_ = auVar35._8_4_ + auVar44._8_4_;
    auVar190._12_4_ = auVar35._12_4_ + auVar44._12_4_;
    auVar208._8_8_ = 0x3f80000000000000;
    auVar208._0_8_ = 0x3f80000000000000;
    auVar35 = vsubps_avx(auVar208,auVar190);
    auVar44 = vsubps_avx(auVar208,auVar34);
    auVar34 = vsubps_avx(auVar39,auVar37);
    auVar37 = vsubps_avx(auVar46,auVar37);
    fVar199 = auVar34._0_4_;
    auVar229._0_4_ = fVar199 * auVar35._0_4_;
    fVar200 = auVar34._4_4_;
    auVar229._4_4_ = fVar200 * auVar35._4_4_;
    fVar201 = auVar34._8_4_;
    auVar229._8_4_ = fVar201 * auVar35._8_4_;
    fVar90 = auVar34._12_4_;
    auVar229._12_4_ = fVar90 * auVar35._12_4_;
    auVar48 = vbroadcastss_avx512vl(auVar32);
    auVar41 = vmulps_avx512vl(auVar48,auVar41);
    auVar42 = vmulps_avx512vl(auVar48,auVar42);
    auVar48 = vminps_avx512vl(auVar41,auVar42);
    auVar42 = vmaxps_avx512vl(auVar42,auVar41);
    auVar41 = vbroadcastss_avx512vl(auVar47);
    auVar40 = vmulps_avx512vl(auVar41,auVar40);
    auVar41 = vmulps_avx512vl(auVar41,auVar38);
    auVar38 = vminps_avx512vl(auVar40,auVar41);
    auVar38 = vaddps_avx512vl(auVar48,auVar38);
    auVar34 = vmulps_avx512vl(auVar34,auVar44);
    in_ZMM17 = ZEXT1664(auVar34);
    fVar202 = auVar37._0_4_;
    auVar191._0_4_ = fVar202 * auVar35._0_4_;
    fVar183 = auVar37._4_4_;
    auVar191._4_4_ = fVar183 * auVar35._4_4_;
    fVar195 = auVar37._8_4_;
    auVar191._8_4_ = fVar195 * auVar35._8_4_;
    fVar197 = auVar37._12_4_;
    auVar191._12_4_ = fVar197 * auVar35._12_4_;
    auVar209._0_4_ = fVar202 * auVar44._0_4_;
    auVar209._4_4_ = fVar183 * auVar44._4_4_;
    auVar209._8_4_ = fVar195 * auVar44._8_4_;
    auVar209._12_4_ = fVar197 * auVar44._12_4_;
    auVar41 = vmaxps_avx(auVar41,auVar40);
    auVar163._0_4_ = auVar42._0_4_ + auVar41._0_4_;
    auVar163._4_4_ = auVar42._4_4_ + auVar41._4_4_;
    auVar163._8_4_ = auVar42._8_4_ + auVar41._8_4_;
    auVar163._12_4_ = auVar42._12_4_ + auVar41._12_4_;
    auVar173._8_8_ = 0x3f800000;
    auVar173._0_8_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar173,auVar163);
    auVar40 = vsubps_avx512vl(auVar173,auVar38);
    auVar222._0_4_ = fVar199 * auVar41._0_4_;
    auVar222._4_4_ = fVar200 * auVar41._4_4_;
    auVar222._8_4_ = fVar201 * auVar41._8_4_;
    auVar222._12_4_ = fVar90 * auVar41._12_4_;
    auVar218._0_4_ = fVar199 * auVar40._0_4_;
    auVar218._4_4_ = fVar200 * auVar40._4_4_;
    auVar218._8_4_ = fVar201 * auVar40._8_4_;
    auVar218._12_4_ = fVar90 * auVar40._12_4_;
    auVar164._0_4_ = fVar202 * auVar41._0_4_;
    auVar164._4_4_ = fVar183 * auVar41._4_4_;
    auVar164._8_4_ = fVar195 * auVar41._8_4_;
    auVar164._12_4_ = fVar197 * auVar41._12_4_;
    auVar174._0_4_ = fVar202 * auVar40._0_4_;
    auVar174._4_4_ = fVar183 * auVar40._4_4_;
    auVar174._8_4_ = fVar195 * auVar40._8_4_;
    auVar174._12_4_ = fVar197 * auVar40._12_4_;
    auVar41 = vminps_avx(auVar222,auVar218);
    auVar40 = vminps_avx512vl(auVar164,auVar174);
    auVar38 = vminps_avx512vl(auVar41,auVar40);
    auVar41 = vmaxps_avx(auVar218,auVar222);
    auVar40 = vmaxps_avx(auVar174,auVar164);
    auVar40 = vmaxps_avx(auVar40,auVar41);
    auVar35 = vminps_avx512vl(auVar229,auVar34);
    auVar41 = vminps_avx(auVar191,auVar209);
    auVar41 = vminps_avx(auVar35,auVar41);
    auVar41 = vhaddps_avx(auVar38,auVar41);
    auVar66._0_16_ = vmaxps_avx512vl(auVar34,auVar229);
    auVar38 = vmaxps_avx(auVar209,auVar191);
    auVar38 = vmaxps_avx(auVar38,auVar66._0_16_);
    auVar40 = vhaddps_avx(auVar40,auVar38);
    auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
    auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
    auVar165._0_4_ = auVar41._0_4_ + auVar45._0_4_;
    auVar165._4_4_ = auVar41._4_4_ + auVar45._4_4_;
    auVar165._8_4_ = auVar41._8_4_ + auVar45._8_4_;
    auVar165._12_4_ = auVar41._12_4_ + auVar45._12_4_;
    auVar175._0_4_ = auVar40._0_4_ + auVar45._0_4_;
    auVar175._4_4_ = auVar40._4_4_ + auVar45._4_4_;
    auVar175._8_4_ = auVar40._8_4_ + auVar45._8_4_;
    auVar175._12_4_ = auVar40._12_4_ + auVar45._12_4_;
    auVar41 = vmaxps_avx(auVar39,auVar165);
    auVar40 = vminps_avx(auVar175,auVar46);
    uVar25 = vcmpps_avx512vl(auVar40,auVar41,1);
  } while ((uVar25 & 3) != 0);
  uVar25 = vcmpps_avx512vl(auVar175,auVar46,1);
  uVar10 = vcmpps_avx512vl(auVar30,auVar165,1);
  if (((ushort)uVar10 & (ushort)uVar25 & 1) == 0) {
    bVar17 = 0;
  }
  else {
    auVar41 = vmovshdup_avx(auVar165);
    bVar17 = auVar43._0_4_ < auVar41._0_4_ & (byte)(uVar25 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar19 || uVar5 != 0 && !bVar28) | bVar17) != 1) goto LAB_017a549e;
  lVar21 = 0xc9;
  do {
    lVar21 = lVar21 + -1;
    if (lVar21 == 0) goto LAB_017a461f;
    auVar30 = vsubss_avx512f(auVar33,auVar45);
    fVar195 = auVar30._0_4_;
    fVar202 = fVar195 * fVar195 * fVar195;
    fVar197 = auVar45._0_4_;
    fVar183 = fVar197 * 3.0 * fVar195 * fVar195;
    fVar195 = fVar195 * fVar197 * fVar197 * 3.0;
    auVar124._4_4_ = fVar202;
    auVar124._0_4_ = fVar202;
    auVar124._8_4_ = fVar202;
    auVar124._12_4_ = fVar202;
    auVar113._4_4_ = fVar183;
    auVar113._0_4_ = fVar183;
    auVar113._8_4_ = fVar183;
    auVar113._12_4_ = fVar183;
    auVar87._4_4_ = fVar195;
    auVar87._0_4_ = fVar195;
    auVar87._8_4_ = fVar195;
    auVar87._12_4_ = fVar195;
    fVar197 = fVar197 * fVar197 * fVar197;
    auVar146._0_4_ = (float)local_f8._0_4_ * fVar197;
    auVar146._4_4_ = (float)local_f8._4_4_ * fVar197;
    auVar146._8_4_ = fStack_f0 * fVar197;
    auVar146._12_4_ = fStack_ec * fVar197;
    auVar30 = vfmadd231ps_fma(auVar146,local_268,auVar87);
    auVar30 = vfmadd231ps_fma(auVar30,local_258,auVar113);
    auVar30 = vfmadd231ps_avx512vl(auVar30,local_2f8,auVar124);
    auVar88._8_8_ = auVar30._0_8_;
    auVar88._0_8_ = auVar30._0_8_;
    auVar30 = vshufpd_avx(auVar30,auVar30,3);
    auVar41 = vshufps_avx(auVar45,auVar45,0x55);
    auVar30 = vsubps_avx(auVar30,auVar88);
    auVar41 = vfmadd213ps_fma(auVar30,auVar41,auVar88);
    fVar202 = auVar41._0_4_;
    auVar30 = vshufps_avx(auVar41,auVar41,0x55);
    auVar89._0_4_ = auVar32._0_4_ * fVar202 + auVar47._0_4_ * auVar30._0_4_;
    auVar89._4_4_ = auVar32._4_4_ * fVar202 + auVar47._4_4_ * auVar30._4_4_;
    auVar89._8_4_ = auVar32._8_4_ * fVar202 + auVar47._8_4_ * auVar30._8_4_;
    auVar89._12_4_ = auVar32._12_4_ * fVar202 + auVar47._12_4_ * auVar30._12_4_;
    auVar45 = vsubps_avx(auVar45,auVar89);
    auVar30 = vandps_avx512vl(auVar41,auVar235._0_16_);
    auVar66._0_16_ = vprolq_avx512vl(auVar30,0x20);
    auVar30 = vmaxss_avx(auVar66._0_16_,auVar30);
    bVar28 = (float)local_108._0_4_ < auVar30._0_4_;
  } while ((float)local_108._0_4_ <= auVar30._0_4_);
  auVar30 = vucomiss_avx512f(auVar36);
  if (bVar28) goto LAB_017a461f;
  auVar32 = vucomiss_avx512f(auVar30);
  auVar239 = ZEXT1664(auVar32);
  if (bVar28) goto LAB_017a461f;
  vmovshdup_avx(auVar30);
  auVar32 = vucomiss_avx512f(auVar36);
  if (bVar28) goto LAB_017a461f;
  auVar33 = vucomiss_avx512f(auVar32);
  auVar239 = ZEXT1664(auVar33);
  if (bVar28) goto LAB_017a461f;
  auVar41 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar36 = vinsertps_avx(auVar41,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar1 = (ray->super_RayK<1>).org.field_0;
  auVar41 = vsubps_avx(local_1a8,(undefined1  [16])aVar1);
  auVar41 = vdpps_avx(auVar41,auVar36,0x7f);
  auVar40 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
  auVar40 = vdpps_avx(auVar40,auVar36,0x7f);
  auVar39 = vsubps_avx(local_1f8,(undefined1  [16])aVar1);
  auVar39 = vdpps_avx(auVar39,auVar36,0x7f);
  auVar38 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
  auVar38 = vdpps_avx(auVar38,auVar36,0x7f);
  auVar35 = vsubps_avx(_local_1b8,(undefined1  [16])aVar1);
  auVar35 = vdpps_avx(auVar35,auVar36,0x7f);
  auVar44 = vsubps_avx(_local_208,(undefined1  [16])aVar1);
  auVar44 = vdpps_avx(auVar44,auVar36,0x7f);
  auVar34 = vsubps_avx(_local_218,(undefined1  [16])aVar1);
  auVar34 = vdpps_avx(auVar34,auVar36,0x7f);
  auVar37 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
  auVar36 = vdpps_avx(auVar37,auVar36,0x7f);
  auVar37 = vsubss_avx512f(auVar33,auVar32);
  fVar202 = auVar32._0_4_;
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * fVar202)),auVar37,auVar41);
  auVar41 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * fVar202)),auVar37,auVar40);
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * fVar202)),auVar37,auVar39);
  auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar36._0_4_)),auVar37,auVar38);
  auVar66._0_16_ = vsubss_avx512f(auVar33,auVar30);
  auVar147._0_4_ = auVar66._0_4_;
  fVar202 = auVar147._0_4_ * auVar147._0_4_ * auVar147._0_4_;
  fVar199 = auVar30._0_4_;
  fVar183 = fVar199 * 3.0 * auVar147._0_4_ * auVar147._0_4_;
  fVar195 = auVar147._0_4_ * fVar199 * fVar199 * 3.0;
  fVar200 = fVar199 * fVar199 * fVar199;
  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * auVar39._0_4_)),ZEXT416((uint)fVar195),auVar40)
  ;
  auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar183),auVar41);
  auVar32 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar202),auVar32);
  fVar197 = auVar32._0_4_;
  if ((fVar197 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
     (fVar201 = (ray->super_RayK<1>).tfar, fVar201 < fVar197)) goto LAB_017a461f;
  auVar32 = vshufps_avx(auVar30,auVar30,0x55);
  auVar41 = vsubps_avx512vl(auVar31,auVar32);
  fVar90 = auVar32._0_4_;
  auVar176._0_4_ = fVar90 * (float)local_1b8._0_4_;
  fVar108 = auVar32._4_4_;
  auVar176._4_4_ = fVar108 * (float)local_1b8._4_4_;
  fVar115 = auVar32._8_4_;
  auVar176._8_4_ = fVar115 * fStack_1b0;
  fVar116 = auVar32._12_4_;
  auVar176._12_4_ = fVar116 * fStack_1ac;
  auVar180._0_4_ = fVar90 * (float)local_208._0_4_;
  auVar180._4_4_ = fVar108 * (float)local_208._4_4_;
  auVar180._8_4_ = fVar115 * fStack_200;
  auVar180._12_4_ = fVar116 * fStack_1fc;
  auVar192._0_4_ = fVar90 * (float)local_218._0_4_;
  auVar192._4_4_ = fVar108 * (float)local_218._4_4_;
  auVar192._8_4_ = fVar115 * fStack_210;
  auVar192._12_4_ = fVar116 * fStack_20c;
  auVar155._0_4_ = fVar90 * (float)local_1d8._0_4_;
  auVar155._4_4_ = fVar108 * (float)local_1d8._4_4_;
  auVar155._8_4_ = fVar115 * fStack_1d0;
  auVar155._12_4_ = fVar116 * fStack_1cc;
  auVar31 = vfmadd231ps_fma(auVar176,auVar41,local_1a8);
  auVar32 = vfmadd231ps_fma(auVar180,auVar41,local_1e8);
  auVar33 = vfmadd231ps_fma(auVar192,auVar41,local_1f8);
  auVar41 = vfmadd231ps_fma(auVar155,auVar41,local_1c8);
  auVar31 = vsubps_avx(auVar32,auVar31);
  auVar32 = vsubps_avx(auVar33,auVar32);
  auVar33 = vsubps_avx(auVar41,auVar33);
  auVar193._0_4_ = fVar199 * auVar32._0_4_;
  auVar193._4_4_ = fVar199 * auVar32._4_4_;
  auVar193._8_4_ = fVar199 * auVar32._8_4_;
  auVar193._12_4_ = fVar199 * auVar32._12_4_;
  auVar147._4_4_ = auVar147._0_4_;
  auVar147._8_4_ = auVar147._0_4_;
  auVar147._12_4_ = auVar147._0_4_;
  auVar31 = vfmadd231ps_fma(auVar193,auVar147,auVar31);
  auVar156._0_4_ = fVar199 * auVar33._0_4_;
  auVar156._4_4_ = fVar199 * auVar33._4_4_;
  auVar156._8_4_ = fVar199 * auVar33._8_4_;
  auVar156._12_4_ = fVar199 * auVar33._12_4_;
  auVar32 = vfmadd231ps_fma(auVar156,auVar147,auVar32);
  auVar157._0_4_ = fVar199 * auVar32._0_4_;
  auVar157._4_4_ = fVar199 * auVar32._4_4_;
  auVar157._8_4_ = fVar199 * auVar32._8_4_;
  auVar157._12_4_ = fVar199 * auVar32._12_4_;
  auVar31 = vfmadd231ps_fma(auVar157,auVar147,auVar31);
  auVar14._8_4_ = 0x40400000;
  auVar14._0_8_ = 0x4040000040400000;
  auVar14._12_4_ = 0x40400000;
  auVar66._0_16_ = vmulps_avx512vl(auVar31,auVar14);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  if ((pGVar6->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_017a461f;
  auVar138._0_4_ = fVar200 * (float)local_148._0_4_;
  auVar138._4_4_ = fVar200 * (float)local_148._4_4_;
  auVar138._8_4_ = fVar200 * fStack_140;
  auVar138._12_4_ = fVar200 * fStack_13c;
  auVar125._4_4_ = fVar195;
  auVar125._0_4_ = fVar195;
  auVar125._8_4_ = fVar195;
  auVar125._12_4_ = fVar195;
  auVar31 = vfmadd132ps_fma(auVar125,auVar138,local_138);
  auVar114._4_4_ = fVar183;
  auVar114._0_4_ = fVar183;
  auVar114._8_4_ = fVar183;
  auVar114._12_4_ = fVar183;
  auVar31 = vfmadd132ps_fma(auVar114,auVar31,local_128);
  auVar105._4_4_ = fVar202;
  auVar105._0_4_ = fVar202;
  auVar105._8_4_ = fVar202;
  auVar105._12_4_ = fVar202;
  auVar33 = vfmadd132ps_fma(auVar105,auVar31,local_118);
  auVar31 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar32 = vshufps_avx(auVar66._0_16_,auVar66._0_16_,0xc9);
  auVar106._0_4_ = auVar33._0_4_ * auVar32._0_4_;
  auVar106._4_4_ = auVar33._4_4_ * auVar32._4_4_;
  auVar106._8_4_ = auVar33._8_4_ * auVar32._8_4_;
  auVar106._12_4_ = auVar33._12_4_ * auVar32._12_4_;
  auVar32 = vfmsub231ps_fma(auVar106,auVar66._0_16_,auVar31);
  auVar31 = vshufps_avx(auVar32,auVar32,0xe9);
  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
    (ray->super_RayK<1>).tfar = fVar197;
    uVar10 = vmovlps_avx(auVar31);
    *(undefined8 *)&(ray->Ng).field_0 = uVar10;
    (ray->Ng).field_0.field_0.z = auVar32._0_4_;
    uVar10 = vmovlps_avx(auVar30);
    ray->u = (float)(int)uVar10;
    ray->v = (float)(int)((ulong)uVar10 >> 0x20);
    ray->primID = (uint)local_300;
    ray->geomID = uVar4;
    ray->instID[0] = context->user->instID[0];
    ray->instPrimID[0] = context->user->instPrimID[0];
    goto LAB_017a461f;
  }
  local_188 = vmovlps_avx(auVar31);
  local_180 = auVar32._0_4_;
  local_17c = vmovlps_avx(auVar30);
  local_174 = (uint)local_300;
  local_170 = uVar4;
  local_16c = context->user->instID[0];
  local_168 = context->user->instPrimID[0];
  (ray->super_RayK<1>).tfar = fVar197;
  local_304 = -1;
  local_248.valid = &local_304;
  local_248.geometryUserPtr = pGVar6->userPtr;
  local_248.context = context->user;
  local_248.ray = (RTCRayN *)ray;
  local_248.hit = (RTCHitN *)&local_188;
  local_248.N = 1;
  if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
    (*pGVar6->intersectionFilterN)(&local_248);
    auVar239 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar30);
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar66);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar231 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar230 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar236 = ZEXT1664(auVar30);
    auVar66._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar235 = ZEXT1664(auVar66._0_16_);
    if (*local_248.valid == 0) goto LAB_017a548d;
  }
  p_Var7 = context->args->filter;
  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
    (*p_Var7)(&local_248);
    auVar239 = ZEXT464(0x3f800000);
    auVar234 = ZEXT3264(_DAT_01fb9fe0);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar233 = ZEXT1664(auVar30);
    auVar66 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar232 = ZEXT3264(auVar66);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar231 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar230 = ZEXT1664(auVar30);
    auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar236 = ZEXT1664(auVar30);
    auVar66._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar235 = ZEXT1664(auVar66._0_16_);
    if (*local_248.valid == 0) {
LAB_017a548d:
      auVar239 = ZEXT464(0x3f800000);
      (ray->super_RayK<1>).tfar = fVar201;
      goto LAB_017a461f;
    }
  }
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).components[0] = *(float *)local_248.hit;
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.y = *(float *)(local_248.hit + 4);
  (((Vec3f *)((long)local_248.ray + 0x30))->field_0).field_0.z = *(float *)(local_248.hit + 8);
  *(float *)((long)local_248.ray + 0x3c) = *(float *)(local_248.hit + 0xc);
  *(float *)((long)local_248.ray + 0x40) = *(float *)(local_248.hit + 0x10);
  *(float *)((long)local_248.ray + 0x44) = *(float *)(local_248.hit + 0x14);
  *(float *)((long)local_248.ray + 0x48) = *(float *)(local_248.hit + 0x18);
  *(float *)((long)local_248.ray + 0x4c) = *(float *)(local_248.hit + 0x1c);
  *(float *)((long)local_248.ray + 0x50) = *(float *)(local_248.hit + 0x20);
  goto LAB_017a461f;
LAB_017a549e:
  auVar95 = vinsertps_avx(auVar43,auVar91,0x10);
  goto LAB_017a4121;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          
          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }